

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visit
          (Flow *__return_storage_ptr__,
          ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *this,Expression *curr)

{
  Type *pTVar1;
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Address>,_std::allocator<std::pair<const_wasm::Name,_wasm::Address>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  uintptr_t *puVar2;
  byte bVar3;
  Id IVar4;
  uintptr_t uVar5;
  Expression *curr_00;
  Module *pMVar6;
  pointer ppvVar7;
  ExternalInterface *pEVar8;
  ExternalInterface *pEVar9;
  Expression EVar10;
  IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
  IVar11;
  Name memoryName;
  Name memoryName_00;
  Name memoryName_01;
  Name memory;
  Name memory_00;
  Name memory_01;
  Name memory_02;
  Name memory_03;
  Name memory_04;
  Name memory_05;
  Name memory_06;
  Name memory_07;
  Name memory_08;
  Name memory_09;
  Name memory_10;
  ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *pEVar12;
  undefined1 auVar13 [8];
  element_type *peVar14;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var15;
  char cVar16;
  int32_t iVar17;
  Shareability share;
  int iVar18;
  uint uVar19;
  Expression **ppEVar20;
  HeapType HVar21;
  Name *pNVar22;
  Literals *pLVar23;
  pointer puVar24;
  SmallVector<wasm::Literal,_1UL> *pSVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  size_t sVar28;
  long *plVar29;
  Literal *pLVar30;
  long lVar31;
  ulong uVar32;
  Type TVar33;
  Address AVar34;
  ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *pMVar35;
  ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *pMVar36;
  ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *pMVar37;
  Address AVar38;
  iterator iVar39;
  mapped_type *pmVar40;
  Address AVar41;
  Address AVar42;
  long lVar43;
  long lVar44;
  ulong uVar45;
  size_type sVar46;
  Literal *pLVar47;
  size_type __new_size;
  Type TVar48;
  ostream *poVar49;
  string *this_01;
  uint uVar50;
  uint *type;
  Field *field;
  pointer pLVar51;
  undefined1 auVar52 [8];
  Flow *pFVar53;
  Literal *this_02;
  shared_ptr<wasm::GCData> *this_03;
  undefined1 in_R8B;
  ExpressionList *__range3;
  char *pcVar54;
  uint64_t uVar55;
  long lVar56;
  char *pcVar57;
  Index loopCount;
  uint64_t uVar58;
  ulong uVar59;
  int64_t i;
  pointer index;
  char *pcVar60;
  bool bVar61;
  undefined4 uVar62;
  undefined4 uVar63;
  undefined4 uVar64;
  undefined4 uVar65;
  IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
  IVar66;
  string_view name;
  Iterator IVar67;
  Name NVar68;
  Name NVar69;
  Name NVar70;
  Name NVar71;
  Name NVar72;
  Name NVar73;
  Name NVar74;
  Name NVar75;
  Name NVar76;
  Name NVar77;
  Name NVar78;
  Name NVar79;
  Name memoryName_02;
  Name memoryName_03;
  Literal local_408;
  int64_t local_3f0;
  address64_t local_3e8;
  int64_t local_3e0;
  ulong local_3d8;
  Literal local_3d0;
  ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *local_3b8;
  size_t local_3b0;
  undefined1 auStack_3a8 [8];
  Field field_4;
  Type local_398;
  undefined1 auStack_378 [8];
  Flow ref;
  undefined1 local_1f0 [8];
  shared_ptr<wasm::GCData> srcData;
  undefined1 auStack_1c8 [8];
  shared_ptr<wasm::GCData> destData;
  undefined1 auStack_1a8 [8];
  Flow length;
  undefined1 auStack_158 [8];
  shared_ptr<wasm::GCData> refData;
  undefined1 auStack_138 [8];
  Literals contents;
  char *local_f8;
  undefined1 auStack_e8 [8];
  Flow end;
  undefined1 auStack_98 [8];
  Flow start;
  Flow *flow_21;
  
  uVar50 = this->depth + 1;
  this->depth = uVar50;
  if (this->maxDepth < uVar50 && this->maxDepth != 0) {
    (*this->_vptr_ExpressionRunner[3])(this,"interpreter recursion limit");
  }
  uVar65 = uRam0000000000181fd4;
  uVar64 = _extendLowUToI32x4;
  uVar63 = NONCONSTANT_FLOW._4_4_;
  uVar62 = (undefined4)NONCONSTANT_FLOW;
  if (curr == (Expression *)0x0) {
    __assert_fail("curr",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                  ,0x3b,
                  "ReturnType wasm::Visitor<(anonymous namespace)::EvallingModuleRunner, wasm::Flow>::visit(Expression *) [SubType = (anonymous namespace)::EvallingModuleRunner, ReturnType = wasm::Flow]"
                 );
  }
  type = &switchD_00138b19::switchdataD_001630f0;
  switch(curr->_id) {
  case BlockId:
    auStack_98 = (undefined1  [8])0x0;
    start.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    start.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
    auStack_e8 = (undefined1  [8])curr;
    std::vector<wasm::Block_*,_std::allocator<wasm::Block_*>_>::push_back
              ((vector<wasm::Block_*,_std::allocator<wasm::Block_*>_> *)auStack_98,
               (value_type *)auStack_e8);
    while (((((Literals *)((long)auStack_e8 + 8))->super_SmallVector<wasm::Literal,_1UL>).flexible.
            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0 &&
           (ppEVar20 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                       operator[]((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                   *)&(((Literals *)((long)auStack_e8 + 8))->
                                      super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].type,
                                  0), (*ppEVar20)->_id == BlockId))) {
      ppEVar20 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            &(((Literals *)((long)auStack_e8 + 8))->
                             super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].type,0);
      auStack_e8 = (undefined1  [8])Expression::cast<wasm::Block>(*ppEVar20);
      std::vector<wasm::Block_*,_std::allocator<wasm::Block_*>_>::push_back
                ((vector<wasm::Block_*,_std::allocator<wasm::Block_*>_> *)auStack_98,
                 (value_type *)auStack_e8);
    }
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0
    .func.super_IString.str._M_str = (char *)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id
         = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0
    .i64 = 0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
    start.breakTo.super_IString.str._M_str =
         *(char **)(start.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed - 8);
    end.breakTo.super_IString.str._M_str = (char *)&__return_storage_ptr__->breakTo;
    puVar24 = (pointer)0x0;
LAB_0013a54b:
    if ((undefined1  [8])start.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed != auStack_98)
    {
      pMVar6 = *(Module **)(start.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed - 8);
      start.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed =
           start.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed - 8;
      auStack_e8 = (undefined1  [8])pMVar6;
      if (puVar24 == (pointer)0x0) goto LAB_0013a591;
      if (puVar24 ==
          (pMVar6->functions).
          super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
LAB_0013a579:
        end.breakTo.super_IString.str._M_str[0] = '\0';
        end.breakTo.super_IString.str._M_str[1] = '\0';
        end.breakTo.super_IString.str._M_str[2] = '\0';
        end.breakTo.super_IString.str._M_str[3] = '\0';
        end.breakTo.super_IString.str._M_str[4] = '\0';
        end.breakTo.super_IString.str._M_str[5] = '\0';
        end.breakTo.super_IString.str._M_str[6] = '\0';
        end.breakTo.super_IString.str._M_str[7] = '\0';
        end.breakTo.super_IString.str._M_str[8] = '\0';
        end.breakTo.super_IString.str._M_str[9] = '\0';
        end.breakTo.super_IString.str._M_str[10] = '\0';
        end.breakTo.super_IString.str._M_str[0xb] = '\0';
        end.breakTo.super_IString.str._M_str[0xc] = '\0';
        end.breakTo.super_IString.str._M_str[0xd] = '\0';
        end.breakTo.super_IString.str._M_str[0xe] = '\0';
        end.breakTo.super_IString.str._M_str[0xf] = '\0';
        goto LAB_0013a586;
      }
      goto LAB_0013a54b;
    }
    std::_Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>::~_Vector_base
              ((_Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_> *)auStack_98);
    goto LAB_00140a9b;
  case IfId:
    visit((Flow *)auStack_378,this,*(Expression **)(curr + 1));
    if (ref.breakTo.super_IString.str._M_len == 0) {
      pLVar30 = Flow::getSingleValue((Flow *)auStack_378);
      iVar17 = Literal::geti32(pLVar30);
      if (iVar17 == 0) {
        if (*(Expression **)(curr + 2) == (Expression *)0x0) goto LAB_0013cac7;
        visit(__return_storage_ptr__,this,*(Expression **)(curr + 2));
      }
      else {
        visit(__return_storage_ptr__,this,(Expression *)curr[1].type.id);
        if (((__return_storage_ptr__->breakTo).super_IString.str._M_str == (char *)0x0) &&
           (*(long *)(curr + 2) == 0)) {
          start.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          start.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          start.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
          start.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          start.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
          start.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.
          super_IString.str._M_str = (char *)0x0;
          auStack_98 = (undefined1  [8])0x0;
          start.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
          start.breakTo.super_IString.str._M_len = 0;
          Flow::operator=(__return_storage_ptr__,(Flow *)auStack_98);
          goto LAB_00140861;
        }
      }
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    }
    break;
  case LoopId:
    uVar50 = 0;
    do {
      visit((Flow *)auStack_378,this,*(Expression **)(curr + 2));
      if ((ref.breakTo.super_IString.str._M_len == 0) ||
         (ref.breakTo.super_IString.str._M_len != curr[1].type.id)) {
        Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
LAB_00139bb1:
        bVar61 = false;
      }
      else {
        bVar61 = true;
        if ((this->maxLoopIterations != 0) &&
           (uVar50 = uVar50 + 1, this->maxLoopIterations <= uVar50)) {
          sVar28 = CONCAT44(NONCONSTANT_FLOW._4_4_,(undefined4)NONCONSTANT_FLOW);
          pcVar54 = (char *)CONCAT44(uRam0000000000181fd4,_extendLowUToI32x4);
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.func.super_IString.str._M_str = (char *)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          type.id = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.i64 = 0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_len = sVar28;
          (__return_storage_ptr__->breakTo).super_IString.str._M_str = pcVar54;
          goto LAB_00139bb1;
        }
      }
      SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)auStack_378);
    } while (bVar61);
    goto LAB_00140a9b;
  case BreakId:
    ref.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ref.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ref.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    ref.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ref.breakTo.super_IString.str._M_len = 0;
    ref.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
    ref.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.
    str._M_str = (char *)0x0;
    auStack_378 = (undefined1  [8])0x0;
    ref.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    if (*(Expression **)(curr + 2) == (Expression *)0x0) {
LAB_00139cc2:
      curr_00 = (Expression *)curr[2].type.id;
      if (curr_00 != (Expression *)0x0) {
        pFVar53 = (Flow *)auStack_98;
        visit(pFVar53,this,curr_00);
        if (start.breakTo.super_IString.str._M_len == 0) {
          Flow::getSingleValue((Flow *)auStack_98);
          lVar56 = wasm::Literal::getInteger();
          if (lVar56 != 0) {
            SmallVector<wasm::Literal,_1UL>::~SmallVector
                      ((SmallVector<wasm::Literal,_1UL> *)auStack_98);
            goto LAB_0013c075;
          }
          pFVar53 = (Flow *)auStack_378;
        }
        Flow::Flow(__return_storage_ptr__,pFVar53);
        goto LAB_00140861;
      }
LAB_0013c075:
      ref.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = *(pointer *)(curr + 1);
      ref.breakTo.super_IString.str._M_len = curr[1].type.id;
    }
    else {
      visit((Flow *)auStack_98,this,*(Expression **)(curr + 2));
      Flow::operator=((Flow *)auStack_378,(Flow *)auStack_98);
      SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)auStack_98);
      if (ref.breakTo.super_IString.str._M_len == 0) goto LAB_00139cc2;
    }
    Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    break;
  case SwitchId:
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0
    .func.super_IString.str._M_str = (char *)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id
         = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0
    .i64 = 0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
    start.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    start.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    start.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    start.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
    start.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.
    str._M_str = (char *)0x0;
    auStack_98 = (undefined1  [8])0x0;
    start.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    if (*(Expression **)(curr + 4) != (Expression *)0x0) {
      visit((Flow *)auStack_378,this,*(Expression **)(curr + 4));
      Flow::operator=(__return_storage_ptr__,(Flow *)auStack_378);
      SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)auStack_378);
      if ((__return_storage_ptr__->breakTo).super_IString.str._M_str != (char *)0x0)
      goto LAB_0013c000;
      SmallVector<wasm::Literal,_1UL>::operator=
                ((SmallVector<wasm::Literal,_1UL> *)auStack_98,
                 (SmallVector<wasm::Literal,_1UL> *)__return_storage_ptr__);
    }
    visit((Flow *)auStack_378,this,(Expression *)curr[4].type.id);
    Flow::operator=(__return_storage_ptr__,(Flow *)auStack_378);
    SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)auStack_378);
    if ((__return_storage_ptr__->breakTo).super_IString.str._M_str == (char *)0x0) {
      Flow::getSingleValue(__return_storage_ptr__);
      uVar59 = wasm::Literal::getInteger();
      auStack_378 = curr[3]._id;
      ref.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed = curr[3].type.id;
      if ((-1 < (long)uVar59) && (uVar59 < curr[1].type.id)) {
        pNVar22 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                            ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(curr + 1),
                             uVar59);
        auStack_378 = (undefined1  [8])(pNVar22->super_IString).str._M_len;
        ref.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed =
             (size_t)(pNVar22->super_IString).str._M_str;
      }
      (__return_storage_ptr__->breakTo).super_IString.str._M_len = (size_t)auStack_378;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str =
           (char *)ref.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
      SmallVector<wasm::Literal,_1UL>::operator=
                ((SmallVector<wasm::Literal,_1UL> *)__return_storage_ptr__,
                 (SmallVector<wasm::Literal,_1UL> *)auStack_98);
    }
    goto LAB_0013c000;
  case CallId:
    name = *(string_view *)(curr + 3);
    start.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    start.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    start.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
    start.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.
    str._M_str = (char *)0x0;
    auStack_98 = (undefined1  [8])0x0;
    start.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    start.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    generateArguments((Flow *)auStack_378,this,(ExpressionList *)(curr + 1),(Literals *)auStack_98);
    if (ref.breakTo.super_IString.str._M_len == 0) {
      NVar73.super_IString.str._M_str = *(char **)(curr + 3);
      NVar73.super_IString.str._M_len = (size_t)this[1]._vptr_ExpressionRunner;
      lVar56 = wasm::Module::getFunction(NVar73);
      HVar21.id = *(uintptr_t *)(lVar56 + 0x38);
      auStack_e8 = (undefined1  [8])this->module;
      cVar16 = wasm::Intrinsics::isCallWithoutEffects((Function *)auStack_e8);
      if (cVar16 != '\0') {
        pLVar30 = SmallVector<wasm::Literal,_1UL>::back
                            ((SmallVector<wasm::Literal,_1UL> *)auStack_98);
        name = (string_view)Literal::getFunc(pLVar30);
        pLVar30 = SmallVector<wasm::Literal,_1UL>::back
                            ((SmallVector<wasm::Literal,_1UL> *)auStack_98);
        HVar21 = Type::getHeapType(&pLVar30->type);
        SmallVector<wasm::Literal,_1UL>::pop_back((SmallVector<wasm::Literal,_1UL> *)auStack_98);
      }
      if (curr[4]._id == BlockId) {
        Literal::Literal((Literal *)auStack_e8,(Name)name,HVar21);
        SmallVector<wasm::Literal,_1UL>::push_back
                  ((SmallVector<wasm::Literal,_1UL> *)auStack_98,(Literal *)auStack_e8);
        wasm::Literal::~Literal((Literal *)auStack_e8);
        pcVar54 = _replaceLaneI64x2;
        sVar28 = RETURN_CALL_FLOW;
        SmallVector<wasm::Literal,_1UL>::SmallVector
                  ((SmallVector<wasm::Literal,_1UL> *)__return_storage_ptr__,
                   (SmallVector<wasm::Literal,_1UL> *)auStack_98);
        (__return_storage_ptr__->breakTo).super_IString.str._M_len = sVar28;
        (__return_storage_ptr__->breakTo).super_IString.str._M_str = pcVar54;
      }
      else {
        SmallVector<wasm::Literal,_1UL>::SmallVector
                  ((SmallVector<wasm::Literal,_1UL> *)auStack_138,
                   (SmallVector<wasm::Literal,_1UL> *)auStack_98);
        ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::callFunction
                  ((Literals *)auStack_e8,
                   (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,(Name)name,
                   (Literals *)auStack_138);
        Flow::Flow(__return_storage_ptr__,(Literals *)auStack_e8);
        SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)auStack_e8)
        ;
        pSVar25 = (SmallVector<wasm::Literal,_1UL> *)auStack_138;
LAB_0013bfef:
        SmallVector<wasm::Literal,_1UL>::~SmallVector(pSVar25);
      }
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    }
LAB_0013bff4:
    SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)auStack_378);
    goto LAB_0013c000;
  case CallIndirectId:
    end.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    end.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    end.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
    end.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.
    str._M_str = (char *)0x0;
    auStack_e8 = (undefined1  [8])0x0;
    end.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    end.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    generateArguments((Flow *)auStack_378,this,(ExpressionList *)&curr[1].type,
                      (Literals *)auStack_e8);
    if (ref.breakTo.super_IString.str._M_len == 0) {
      visit((Flow *)auStack_98,this,(Expression *)curr[3].type.id);
      if (start.breakTo.super_IString.str._M_len == 0) {
        Flow::getSingleValue((Flow *)auStack_98);
        uVar26 = wasm::Literal::getUnsigned();
        ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::getTableInstanceInfo
                  ((TableInstanceInfo *)auStack_1a8,
                   (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                   (Name)curr[4]);
        if (curr[5]._id == BlockId) {
          (*(*(ExternalInterface **)((long)auStack_1a8 + 0x200))->_vptr_ExternalInterface[0x1d])
                    (auStack_138,*(ExternalInterface **)((long)auStack_1a8 + 0x200),
                     length.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed,
                     length.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.
                     i64,uVar26);
          uVar26 = contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64;
          Type::Type((Type *)auStack_158,(HeapType)*(uintptr_t *)(curr + 1),NonNullable,Inexact);
          cVar16 = wasm::Type::isSubType((Type)uVar26,(Type)auStack_158);
          if (cVar16 == '\0') {
            (*this->_vptr_ExpressionRunner[2])(this,"cast failure in call_indirect");
          }
          SmallVector<wasm::Literal,_1UL>::push_back
                    ((SmallVector<wasm::Literal,_1UL> *)auStack_e8,(Literal *)auStack_138);
          pcVar54 = _replaceLaneI64x2;
          sVar28 = RETURN_CALL_FLOW;
          SmallVector<wasm::Literal,_1UL>::SmallVector
                    ((SmallVector<wasm::Literal,_1UL> *)__return_storage_ptr__,
                     (SmallVector<wasm::Literal,_1UL> *)auStack_e8);
          (__return_storage_ptr__->breakTo).super_IString.str._M_len = sVar28;
          (__return_storage_ptr__->breakTo).super_IString.str._M_str = pcVar54;
          pLVar30 = (Literal *)auStack_138;
          goto LAB_0013dc01;
        }
        (*(*(ExternalInterface **)((long)auStack_1a8 + 0x200))->_vptr_ExternalInterface[5])
                  (auStack_138,*(ExternalInterface **)((long)auStack_1a8 + 0x200),
                   length.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed,
                   length.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64
                   ,uVar26,*(undefined8 *)(curr + 1),(Literals *)auStack_e8,(curr->type).id,this);
        Flow::Flow(__return_storage_ptr__,(Literals *)auStack_138);
        SmallVector<wasm::Literal,_1UL>::~SmallVector
                  ((SmallVector<wasm::Literal,_1UL> *)auStack_138);
      }
      else {
        Flow::Flow(__return_storage_ptr__,(Flow *)auStack_98);
      }
LAB_0013dc06:
      SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)auStack_98);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    }
    goto LAB_0013dc12;
  case LocalGetId:
    pLVar23 = (Literals *)
              ((ulong)*(uint *)(curr + 1) * 0x38 + **(long **)&this[9].maxLoopIterations);
    goto LAB_00139d1f;
  case LocalSetId:
    uVar50 = *(uint *)(curr + 1);
    visit((Flow *)auStack_378,this,(Expression *)curr[1].type.id);
    if (ref.breakTo.super_IString.str._M_len == 0) {
      cVar16 = wasm::LocalSet::isTee();
      if (cVar16 != '\0') {
        TVar33 = Literals::getType((Literals *)auStack_378);
        cVar16 = wasm::Type::isSubType(TVar33,(Type)(curr->type).id);
        if (cVar16 == '\0') {
          __assert_fail("curr->isTee() ? Type::isSubType(flow.getType(), curr->type) : true",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                        ,0xdfa,
                        "Flow wasm::ModuleRunnerBase<(anonymous namespace)::EvallingModuleRunner>::visitLocalSet(LocalSet *) [SubType = (anonymous namespace)::EvallingModuleRunner]"
                       );
        }
      }
      SmallVector<wasm::Literal,_1UL>::operator=
                ((SmallVector<wasm::Literal,_1UL> *)
                 ((ulong)uVar50 * 0x38 + **(long **)&this[9].maxLoopIterations),
                 (SmallVector<wasm::Literal,_1UL> *)auStack_378);
      cVar16 = wasm::LocalSet::isTee();
      if (cVar16 == '\0') goto LAB_0013cac7;
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    }
    break;
  case GlobalGetId:
    NVar69.super_IString.str._M_str = *(char **)(curr + 1);
    NVar69.super_IString.str._M_len = (size_t)this[1]._vptr_ExpressionRunner;
    lVar56 = wasm::Module::getGlobal(NVar69);
    if (*(long *)(lVar56 + 0x20) != 0) {
      this_01 = (string *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)auStack_138,"read from imported global ",(allocator<char> *)auStack_1c8);
      IString::toString_abi_cxx11_((string *)auStack_1a8,(IString *)(lVar56 + 0x18));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_e8
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      auStack_138,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     auStack_1a8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_98
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      auStack_e8,".");
      IString::toString_abi_cxx11_((string *)auStack_158,(IString *)(lVar56 + 0x28));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     auStack_378,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_98
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      auStack_158);
      std::__cxx11::string::string(this_01,(string *)auStack_378);
      __cxa_throw(this_01,&(anonymous_namespace)::FailToEvalException::typeinfo,
                  anon_unknown.dwarf_5fce8::FailToEvalException::~FailToEvalException);
    }
    pLVar23 = ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::getGlobal
                        ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                         (Name)curr[1]);
LAB_00139d1f:
    Flow::Flow(__return_storage_ptr__,pLVar23);
    goto LAB_00140a9b;
  case GlobalSetId:
    EVar10 = curr[1];
    visit((Flow *)auStack_378,this,*(Expression **)(curr + 2));
    if (ref.breakTo.super_IString.str._M_len == 0) {
      pSVar25 = &ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::getGlobal
                           ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                            (Name)EVar10)->super_SmallVector<wasm::Literal,_1UL>;
      SmallVector<wasm::Literal,_1UL>::operator=
                (pSVar25,(SmallVector<wasm::Literal,_1UL> *)auStack_378);
LAB_0013cac7:
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
      field_0.func.super_IString.str._M_str = (char *)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.
      id = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
      field_0.i64 = 0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    }
    break;
  case LoadId:
    visit((Flow *)auStack_378,this,*(Expression **)(curr + 3));
    if (ref.breakTo.super_IString.str._M_len == 0) {
      ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::getMemoryInstanceInfo
                ((MemoryInstanceInfo *)auStack_e8,
                 (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                 (IString)*(IString *)&curr[3].type);
      uVar26 = end.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64;
      sVar28 = end.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
      auVar52 = auStack_e8;
      memory_08.super_IString.str._M_str =
           (char *)end.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64;
      memory_08.super_IString.str._M_len =
           end.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
      AVar34 = ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::getMemorySize
                         ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
                          auStack_e8,memory_08);
      pLVar30 = Flow::getSingleValue((Flow *)auStack_378);
      wasm::Literal::Literal((Literal *)auStack_138,pLVar30);
      wasm::Literal::Literal((Literal *)auStack_98,(Literal *)auStack_138);
      end.breakTo.super_IString.str._M_str = (char *)uVar26;
      start.breakTo.super_IString.str._M_str = (char *)sVar28;
      IVar4 = curr[1]._id;
      if (start.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 == 2) {
        iVar17 = Literal::geti32((Literal *)auStack_98);
        uVar58 = (uint64_t)iVar17;
      }
      else {
        uVar58 = Literal::geti64((Literal *)auStack_98);
      }
      uVar55 = AVar34.addr * 0x10000;
      ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::trapIfGt
                ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)auVar52,
                 curr[1].type.id,uVar55,"offset > memory");
      ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::trapIfGt
                ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)auVar52,uVar58,
                 uVar55 - curr[1].type.id,"final > memory");
      AVar38.addr = uVar58 + curr[1].type.id;
      ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::trapIfGt
                ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)auVar52,
                 (ulong)IVar4,uVar55,"bytes > memory");
      ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::checkLoadAddress
                ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)auVar52,AVar38,
                 (uint)IVar4,AVar34);
      wasm::Literal::~Literal((Literal *)auStack_98);
      wasm::Literal::~Literal((Literal *)auStack_138);
      pcVar60 = start.breakTo.super_IString.str._M_str;
      pcVar54 = end.breakTo.super_IString.str._M_str;
      if ((char)curr[2].type.id == '\x01') {
        ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::checkAtomicAddress
                  ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)auVar52,AVar38,
                   (uint)curr[1]._id,AVar34);
      }
      ppvVar7 = (((MixedArena *)((long)auVar52 + 0x200))->chunks).
                super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
                _M_start;
      (**(code **)((long)*ppvVar7 + 0x58))(auStack_98,ppvVar7,curr,AVar38.addr,pcVar60,pcVar54);
      wasm::Literal::Literal((Literal *)auStack_1a8,(Literal *)auStack_98);
      Flow::Flow(__return_storage_ptr__,(Literal *)auStack_1a8);
      pLVar30 = (Literal *)auStack_1a8;
LAB_0013f014:
      wasm::Literal::~Literal(pLVar30);
LAB_0013f019:
      pLVar30 = (Literal *)auStack_98;
      goto LAB_00140a8a;
    }
    Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    break;
  case StoreId:
    visit((Flow *)auStack_378,this,*(Expression **)(curr + 3));
    if (ref.breakTo.super_IString.str._M_len == 0) {
      visit((Flow *)auStack_98,this,(Expression *)curr[3].type.id);
      if (start.breakTo.super_IString.str._M_len == 0) {
        ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::getMemoryInstanceInfo
                  ((MemoryInstanceInfo *)auStack_138,
                   (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                   (IString)*(IString *)&curr[4].type);
        sVar28 = contents.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
        auVar52 = auStack_138;
        memory_03.super_IString.str._M_str =
             (char *)contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64;
        memory_03.super_IString.str._M_len =
             contents.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
        start.breakTo.super_IString.str._M_str =
             (char *)contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.gcData
                     .super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        AVar34 = ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::getMemorySize
                           ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
                            auStack_138,memory_03);
        pLVar30 = Flow::getSingleValue((Flow *)auStack_378);
        wasm::Literal::Literal((Literal *)auStack_1a8,pLVar30);
        wasm::Literal::Literal((Literal *)auStack_e8,(Literal *)auStack_1a8);
        end.breakTo.super_IString.str._M_str = (char *)sVar28;
        IVar4 = curr[1]._id;
        if (end.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 == 2) {
          iVar17 = Literal::geti32((Literal *)auStack_e8);
          uVar58 = (uint64_t)iVar17;
        }
        else {
          uVar58 = Literal::geti64((Literal *)auStack_e8);
        }
        uVar55 = AVar34.addr * 0x10000;
        ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::trapIfGt
                  ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)auVar52,
                   curr[1].type.id,uVar55,"offset > memory");
        ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::trapIfGt
                  ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)auVar52,uVar58,
                   uVar55 - curr[1].type.id,"final > memory");
        AVar38.addr = uVar58 + curr[1].type.id;
        ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::trapIfGt
                  ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)auVar52,
                   (ulong)IVar4,uVar55,"bytes > memory");
        ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::checkLoadAddress
                  ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)auVar52,AVar38,
                   (uint)IVar4,AVar34);
        wasm::Literal::~Literal((Literal *)auStack_e8);
        wasm::Literal::~Literal((Literal *)auStack_1a8);
        pcVar54 = end.breakTo.super_IString.str._M_str;
        if ((char)curr[2].type.id == '\x01') {
          ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::checkAtomicAddress
                    ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)auVar52,AVar38
                     ,(uint)curr[1]._id,AVar34);
        }
        pEVar8 = *(ExternalInterface **)((long)auVar52 + 0x200);
        pLVar30 = Flow::getSingleValue((Flow *)auStack_98);
        wasm::Literal::Literal((Literal *)auStack_e8,pLVar30);
        (*pEVar8->_vptr_ExternalInterface[0xc])
                  (pEVar8,curr,AVar38.addr,auStack_e8,pcVar54,start.breakTo.super_IString.str._M_str
                  );
        wasm::Literal::~Literal((Literal *)auStack_e8);
LAB_0013de62:
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
        field_0.func.super_IString.str._M_str = (char *)0x0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
        type.id = 0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
        field_0.i64 = 0;
        (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
      }
      else {
        Flow::Flow(__return_storage_ptr__,(Flow *)auStack_98);
      }
      goto LAB_00140861;
    }
    Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    break;
  case ConstId:
    wasm::Literal::Literal((Literal *)auStack_378,(Literal *)(curr + 1));
    Flow::Flow(__return_storage_ptr__,(Literal *)auStack_378);
    goto LAB_0013a312;
  case UnaryId:
    visitUnary(__return_storage_ptr__,this,(Unary *)curr);
    goto LAB_00140a9b;
  case BinaryId:
    visitBinary(__return_storage_ptr__,this,(Binary *)curr);
    goto LAB_00140a9b;
  case SelectId:
    visit((Flow *)auStack_378,this,*(Expression **)(curr + 1));
    if (ref.breakTo.super_IString.str._M_len == 0) {
      visit((Flow *)auStack_98,this,(Expression *)curr[1].type.id);
      if (start.breakTo.super_IString.str._M_len != 0) {
        Flow::Flow(__return_storage_ptr__,(Flow *)auStack_98);
        goto LAB_00140861;
      }
      visit((Flow *)auStack_e8,this,*(Expression **)(curr + 2));
      if (end.breakTo.super_IString.str._M_len == 0) {
        pLVar30 = Flow::getSingleValue((Flow *)auStack_e8);
        iVar17 = Literal::geti32(pLVar30);
        pFVar53 = (Flow *)auStack_378;
        if (iVar17 == 0) {
          pFVar53 = (Flow *)auStack_98;
        }
        Flow::Flow(__return_storage_ptr__,pFVar53);
      }
      else {
        Flow::Flow(__return_storage_ptr__,(Flow *)auStack_e8);
      }
LAB_00140855:
      pSVar25 = (SmallVector<wasm::Literal,_1UL> *)auStack_e8;
LAB_0014085c:
      SmallVector<wasm::Literal,_1UL>::~SmallVector(pSVar25);
      goto LAB_00140861;
    }
    Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    break;
  case DropId:
    visit((Flow *)auStack_378,this,*(Expression **)(curr + 1));
    if (ref.breakTo.super_IString.str._M_len == 0) goto LAB_0013cac7;
    Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    break;
  case ReturnId:
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0
    .func.super_IString.str._M_str = (char *)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id
         = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0
    .i64 = 0;
    uVar62 = (undefined4)RETURN_FLOW;
    uVar63 = RETURN_FLOW._4_4_;
    uVar64 = _getStruct;
    uVar65 = uRam0000000000181d5c;
    if (*(Expression **)(curr + 1) != (Expression *)0x0) {
      visit((Flow *)auStack_378,this,*(Expression **)(curr + 1));
      Flow::operator=(__return_storage_ptr__,(Flow *)auStack_378);
      SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)auStack_378);
      uVar62 = (undefined4)RETURN_FLOW;
      uVar63 = RETURN_FLOW._4_4_;
      uVar64 = _getStruct;
      uVar65 = uRam0000000000181d5c;
      if ((__return_storage_ptr__->breakTo).super_IString.str._M_str != (char *)0x0)
      goto LAB_00140a9b;
    }
    goto LAB_00138b3c;
  case MemorySizeId:
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::getMemoryInstanceInfo
              ((MemoryInstanceInfo *)auStack_378,
               (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,(Name)curr[1]);
    sVar28 = ref.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
    auVar52 = auStack_378;
    memory.super_IString.str._M_str =
         (char *)ref.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64;
    memory.super_IString.str._M_len = ref.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
    AVar34 = ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::getMemorySize
                       ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)auStack_378
                        ,memory);
    NVar71.super_IString.str._M_str = (char *)sVar28;
    NVar71.super_IString.str._M_len = (size_t)*(Module **)((long)auVar52 + 0x20);
    lVar56 = wasm::Module::getMemory(NVar71);
    Literal::makeFromInt64((Literal *)auStack_98,AVar34.addr,(Type)*(uintptr_t *)(lVar56 + 0x50));
    Flow::Flow(__return_storage_ptr__,(Literal *)auStack_98);
    goto LAB_0013a2e2;
  case MemoryGrowId:
    visit((Flow *)auStack_378,this,*(Expression **)(curr + 1));
    if (ref.breakTo.super_IString.str._M_len == 0) {
      ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::getMemoryInstanceInfo
                ((MemoryInstanceInfo *)auStack_e8,
                 (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                 (IString)*(IString *)&curr[1].type);
      uVar26 = end.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64;
      sVar28 = end.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
      auVar52 = auStack_e8;
      memory_09.super_IString.str._M_str =
           (char *)end.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64;
      memory_09.super_IString.str._M_len =
           end.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
      AVar34 = ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::getMemorySize
                         ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
                          auStack_e8,memory_09);
      start.breakTo.super_IString.str._M_str = (char *)auVar52;
      end.breakTo.super_IString.str._M_str = (char *)sVar28;
      NVar72.super_IString.str._M_str = (char *)sVar28;
      NVar72.super_IString.str._M_len =
           (((Literals *)((long)auVar52 + 8))->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems
           [0].type.id;
      lVar56 = wasm::Module::getMemory(NVar72);
      TVar33.id = *(uintptr_t *)(lVar56 + 0x50);
      Literal::makeFromInt64((Literal *)auStack_138,-1,TVar33);
      Literal::makeFromInt64((Literal *)auStack_1a8,AVar34.addr,TVar33);
      Flow::Flow((Flow *)auStack_98,(Literal *)auStack_1a8);
      wasm::Literal::~Literal((Literal *)auStack_1a8);
      Flow::getSingleValue((Flow *)auStack_378);
      uVar59 = wasm::Literal::getUnsigned();
      pcVar60 = start.breakTo.super_IString.str._M_str;
      pcVar54 = end.breakTo.super_IString.str._M_str;
      uVar32 = -(ulong)(TVar33.id != 2) | 0xffffffff;
      if (uVar32 >> 0x10 < uVar59) {
        wasm::Literal::Literal((Literal *)auStack_158,(Literal *)auStack_138);
        Flow::Flow(__return_storage_ptr__,(Literal *)auStack_158);
LAB_0013d886:
        wasm::Literal::~Literal((Literal *)auStack_158);
      }
      else {
        if (uVar32 - uVar59 <= AVar34.addr) {
          wasm::Literal::Literal((Literal *)auStack_158,(Literal *)auStack_138);
          Flow::Flow(__return_storage_ptr__,(Literal *)auStack_158);
          goto LAB_0013d886;
        }
        uVar59 = uVar59 + AVar34.addr;
        if (*(ulong *)(lVar56 + 0x40) < uVar59) {
          wasm::Literal::Literal((Literal *)auStack_158,(Literal *)auStack_138);
          Flow::Flow(__return_storage_ptr__,(Literal *)auStack_158);
          goto LAB_0013d886;
        }
        cVar16 = (**(code **)(**(long **)(start.breakTo.super_IString.str._M_str + 0x200) + 0x30))
                           (*(long **)(start.breakTo.super_IString.str._M_str + 0x200),
                            end.breakTo.super_IString.str._M_str,uVar26,AVar34.addr << 0x10,
                            uVar59 * 0x10000);
        if (cVar16 == '\0') {
          wasm::Literal::Literal((Literal *)auStack_158,(Literal *)auStack_138);
          Flow::Flow(__return_storage_ptr__,(Literal *)auStack_158);
          goto LAB_0013d886;
        }
        auStack_158 = (undefined1  [8])pcVar54;
        refData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)uVar26;
        this_00 = (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Address>,_std::allocator<std::pair<const_wasm::Name,_wasm::Address>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(pcVar60 + 0x100);
        iVar39 = std::
                 _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Address>,_std::allocator<std::pair<const_wasm::Name,_wasm::Address>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(this_00,(key_type *)auStack_158);
        if (iVar39.super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Address>,_true>.
            _M_cur == (__node_type *)0x0) {
          plVar29 = *(long **)(pcVar60 + 0x200);
          (**(code **)(*plVar29 + 0x40))(plVar29,"setMemorySize called on non-existing memory");
        }
        pmVar40 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Address>,_std::allocator<std::pair<const_wasm::Name,_wasm::Address>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Address>,_std::allocator<std::pair<const_wasm::Name,_wasm::Address>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_00,(key_type *)auStack_158);
        pmVar40->addr = uVar59;
        Flow::Flow(__return_storage_ptr__,(Flow *)auStack_98);
      }
      SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)auStack_98);
      goto LAB_0013d89a;
    }
    Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    break;
  case NopId:
  case AtomicFenceId:
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0
    .func.super_IString.str._M_str = (char *)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id
         = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0
    .i64 = 0;
    goto LAB_001398f1;
  case UnreachableId:
    (*this->_vptr_ExpressionRunner[2])(this,"unreachable");
    wasm::handle_unreachable
              ("unreachable",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
               ,0x57a);
  case AtomicRMWId:
    visit((Flow *)auStack_378,this,*(Expression **)(curr + 2));
    if (ref.breakTo.super_IString.str._M_len != 0) {
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
      break;
    }
    visit((Flow *)auStack_98,this,(Expression *)curr[2].type.id);
    if (start.breakTo.super_IString.str._M_len != 0) {
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_98);
      goto LAB_00140861;
    }
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::getMemoryInstanceInfo
              ((MemoryInstanceInfo *)auStack_138,
               (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,(Name)curr[3]);
    uVar26 = contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64;
    sVar28 = contents.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
    auVar52 = auStack_138;
    memory_02.super_IString.str._M_str =
         (char *)contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64;
    memory_02.super_IString.str._M_len = contents.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
    start.breakTo.super_IString.str._M_str =
         (char *)ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::getMemorySize
                           ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
                            auStack_138,memory_02);
    pLVar30 = Flow::getSingleValue((Flow *)auStack_378);
    wasm::Literal::Literal((Literal *)auStack_1a8,pLVar30);
    end.breakTo.super_IString.str._M_str = (char *)uVar26;
    wasm::Literal::Literal((Literal *)auStack_e8,(Literal *)auStack_1a8);
    bVar3 = curr[1].field_0x4;
    if (end.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 == 2) {
      iVar17 = Literal::geti32((Literal *)auStack_e8);
      uVar58 = (uint64_t)iVar17;
    }
    else {
      uVar58 = Literal::geti64((Literal *)auStack_e8);
    }
    uVar55 = (long)start.breakTo.super_IString.str._M_str * 0x10000;
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::trapIfGt
              ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)auVar52,
               curr[1].type.id,uVar55,"offset > memory");
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::trapIfGt
              ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)auVar52,uVar58,
               uVar55 - curr[1].type.id,"final > memory");
    AVar34.addr = uVar58 + curr[1].type.id;
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::trapIfGt
              ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)auVar52,
               (ulong)(uint)bVar3,uVar55,"bytes > memory");
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::checkLoadAddress
              ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)auVar52,AVar34,
               (uint)bVar3,(Address)start.breakTo.super_IString.str._M_str);
    wasm::Literal::~Literal((Literal *)auStack_e8);
    wasm::Literal::~Literal((Literal *)auStack_1a8);
    memoryName.super_IString.str._M_str =
         (char *)contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64;
    memoryName.super_IString.str._M_len = contents.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::doAtomicLoad
              ((Literal *)auStack_e8,
               (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)auVar52,AVar34,
               (uint)(byte)curr[1].field_0x4,(Type)(curr->type).id,memoryName,
               (Address)start.breakTo.super_IString.str._M_str);
    pLVar30 = Flow::getSingleValue((Flow *)auStack_98);
    wasm::Literal::Literal((Literal *)auStack_158,pLVar30);
    switch(*(undefined4 *)(curr + 1)) {
    case 0:
      wasm::Literal::add((Literal *)auStack_1c8);
      wasm::Literal::operator=((Literal *)auStack_158,(Literal *)auStack_1c8);
      break;
    case 1:
      wasm::Literal::sub((Literal *)auStack_1c8);
      wasm::Literal::operator=((Literal *)auStack_158,(Literal *)auStack_1c8);
      break;
    case 2:
      wasm::Literal::and_((Literal *)auStack_1c8);
      wasm::Literal::operator=((Literal *)auStack_158,(Literal *)auStack_1c8);
      break;
    case 3:
      wasm::Literal::or_((Literal *)auStack_1c8);
      wasm::Literal::operator=((Literal *)auStack_158,(Literal *)auStack_1c8);
      break;
    case 4:
      wasm::Literal::xor_((Literal *)auStack_1c8);
      wasm::Literal::operator=((Literal *)auStack_158,(Literal *)auStack_1c8);
      break;
    default:
      goto switchD_0013dd27_default;
    }
    wasm::Literal::~Literal((Literal *)auStack_1c8);
switchD_0013dd27_default:
    bVar3 = curr[1].field_0x4;
    wasm::Literal::Literal((Literal *)auStack_1c8,(Literal *)auStack_158);
    memoryName_02.super_IString.str._M_str = end.breakTo.super_IString.str._M_str;
    memoryName_02.super_IString.str._M_len = sVar28;
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::doAtomicStore
              ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)auVar52,AVar34,
               (uint)bVar3,(Literal *)auStack_1c8,memoryName_02,
               (Address)start.breakTo.super_IString.str._M_str);
    wasm::Literal::~Literal((Literal *)auStack_1c8);
    wasm::Literal::Literal((Literal *)local_1f0,(Literal *)auStack_e8);
    Flow::Flow(__return_storage_ptr__,(Literal *)local_1f0);
    wasm::Literal::~Literal((Literal *)local_1f0);
    wasm::Literal::~Literal((Literal *)auStack_158);
    goto LAB_0013f84f;
  case AtomicCmpxchgId:
    visit((Flow *)auStack_378,this,*(Expression **)(curr + 2));
    if (ref.breakTo.super_IString.str._M_len == 0) {
      visit((Flow *)auStack_98,this,(Expression *)curr[2].type.id);
      if (start.breakTo.super_IString.str._M_len != 0) {
        Flow::Flow(__return_storage_ptr__,(Flow *)auStack_98);
        goto LAB_00140861;
      }
      visit((Flow *)auStack_e8,this,*(Expression **)(curr + 3));
      if (end.breakTo.super_IString.str._M_len != 0) {
        Flow::Flow(__return_storage_ptr__,(Flow *)auStack_e8);
        goto LAB_00140855;
      }
      ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::getMemoryInstanceInfo
                ((MemoryInstanceInfo *)auStack_158,
                 (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                 (IString)*(IString *)&curr[3].type);
      _Var15 = refData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      peVar14 = refData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      auVar52 = auStack_158;
      memory_01.super_IString.str._M_str =
           (char *)refData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
      memory_01.super_IString.str._M_len =
           (size_t)refData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      start.breakTo.super_IString.str._M_str =
           (char *)ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::getMemorySize
                             ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
                              auStack_158,memory_01);
      pLVar30 = Flow::getSingleValue((Flow *)auStack_378);
      wasm::Literal::Literal((Literal *)auStack_1c8,pLVar30);
      end.breakTo.super_IString.str._M_str = (char *)_Var15._M_pi;
      wasm::Literal::Literal((Literal *)auStack_138,(Literal *)auStack_1c8);
      IVar4 = curr[1]._id;
      if (contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 == 2) {
        iVar17 = Literal::geti32((Literal *)auStack_138);
        uVar58 = (uint64_t)iVar17;
      }
      else {
        uVar58 = Literal::geti64((Literal *)auStack_138);
      }
      uVar55 = (long)start.breakTo.super_IString.str._M_str * 0x10000;
      ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::trapIfGt
                ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)auVar52,
                 curr[1].type.id,uVar55,"offset > memory");
      ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::trapIfGt
                ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)auVar52,uVar58,
                 uVar55 - curr[1].type.id,"final > memory");
      AVar34.addr = uVar58 + curr[1].type.id;
      ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::trapIfGt
                ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)auVar52,
                 (ulong)(uint)IVar4,uVar55,"bytes > memory");
      ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::checkLoadAddress
                ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)auVar52,AVar34,
                 (uint)IVar4,(Address)start.breakTo.super_IString.str._M_str);
      wasm::Literal::~Literal((Literal *)auStack_138);
      wasm::Literal::~Literal((Literal *)auStack_1c8);
      pLVar30 = Flow::getSingleValue((Flow *)auStack_98);
      wasm::Literal::Literal((Literal *)auStack_3a8,pLVar30);
      IVar4 = curr[1]._id;
      if (local_398.id == 3) {
        uVar50 = 0x1184;
        switch(IVar4) {
        case BlockId:
          auStack_1a8 = (undefined1  [8])0xff;
          length.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 3;
          wasm::Literal::and_((Literal *)local_1f0);
          break;
        case IfId:
          auStack_1a8 = (undefined1  [8])0xffff;
          length.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 3;
          wasm::Literal::and_((Literal *)local_1f0);
          break;
        default:
switchD_0013f5f3_caseD_3:
          wasm::handle_unreachable
                    ("unexpected bytes",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                     ,uVar50);
        case BreakId:
          auStack_1a8 = (undefined1  [8])0xffffffff;
          length.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 3;
          wasm::Literal::and_((Literal *)local_1f0);
          break;
        case LocalGetId:
          goto switchD_0013f5f3_caseD_8;
        }
LAB_00140720:
        wasm::Literal::~Literal((Literal *)auStack_1a8);
      }
      else {
        if (local_398.id != 2) {
          __assert_fail("value.type == Type::i64",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                        ,0x1175,
                        "Literal wasm::ModuleRunnerBase<(anonymous namespace)::EvallingModuleRunner>::wrapToSmallerSize(Literal, Index) [SubType = (anonymous namespace)::EvallingModuleRunner]"
                       );
        }
        if (IVar4 != BreakId) {
          if (IVar4 == IfId) {
            auStack_1a8._0_4_ = 0xffff;
            length.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 2;
            wasm::Literal::and_((Literal *)local_1f0);
          }
          else {
            if (IVar4 != BlockId) {
              uVar50 = 0x1172;
              goto switchD_0013f5f3_caseD_3;
            }
            auStack_1a8._0_4_ = 0xff;
            length.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 2;
            wasm::Literal::and_((Literal *)local_1f0);
          }
          goto LAB_00140720;
        }
switchD_0013f5f3_caseD_8:
        wasm::Literal::Literal((Literal *)local_1f0,(Literal *)auStack_3a8);
      }
      Flow::Flow((Flow *)auStack_138,(Literal *)local_1f0);
      Flow::operator=((Flow *)auStack_98,(Flow *)auStack_138);
      SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)auStack_138);
      wasm::Literal::~Literal((Literal *)local_1f0);
      wasm::Literal::~Literal((Literal *)auStack_3a8);
      memoryName_01.super_IString.str._M_str =
           (char *)refData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
      memoryName_01.super_IString.str._M_len =
           (size_t)refData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::doAtomicLoad
                ((Literal *)auStack_138,
                 (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)auVar52,AVar34,
                 (uint)curr[1]._id,(Type)(curr->type).id,memoryName_01,
                 (Address)start.breakTo.super_IString.str._M_str);
      pLVar30 = Flow::getSingleValue((Flow *)auStack_98);
      cVar16 = wasm::Literal::operator==((Literal *)auStack_138,pLVar30);
      if (cVar16 != '\0') {
        IVar4 = curr[1]._id;
        pLVar30 = Flow::getSingleValue((Flow *)auStack_e8);
        wasm::Literal::Literal((Literal *)auStack_1a8,pLVar30);
        memoryName_03.super_IString.str._M_str = end.breakTo.super_IString.str._M_str;
        memoryName_03.super_IString.str._M_len = (size_t)peVar14;
        ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::doAtomicStore
                  ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)auVar52,AVar34,
                   (uint)IVar4,(Literal *)auStack_1a8,memoryName_03,
                   (Address)start.breakTo.super_IString.str._M_str);
        wasm::Literal::~Literal((Literal *)auStack_1a8);
      }
      wasm::Literal::Literal(&local_3d0,(Literal *)auStack_138);
      Flow::Flow(__return_storage_ptr__,&local_3d0);
      wasm::Literal::~Literal(&local_3d0);
LAB_00140849:
      pLVar30 = (Literal *)auStack_138;
LAB_00140850:
      wasm::Literal::~Literal(pLVar30);
      goto LAB_00140855;
    }
    Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    break;
  case AtomicWaitId:
    visit((Flow *)auStack_378,this,(Expression *)curr[1].type.id);
    if (ref.breakTo.super_IString.str._M_len == 0) {
      visit((Flow *)auStack_98,this,*(Expression **)(curr + 2));
      if (start.breakTo.super_IString.str._M_len != 0) {
        Flow::Flow(__return_storage_ptr__,(Flow *)auStack_98);
        goto LAB_00140861;
      }
      visit((Flow *)auStack_e8,this,(Expression *)curr[2].type.id);
      if (end.breakTo.super_IString.str._M_len != 0) {
        Flow::Flow(__return_storage_ptr__,(Flow *)auStack_e8);
        goto LAB_00140855;
      }
      uVar50 = wasm::Type::getByteSize();
      ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::getMemoryInstanceInfo
                ((MemoryInstanceInfo *)auStack_138,
                 (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                 (IString)*(IString *)&curr[3].type);
      auVar52 = auStack_138;
      memory_04.super_IString.str._M_str =
           (char *)contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64;
      memory_04.super_IString.str._M_len = contents.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
      AVar34 = ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::getMemorySize
                         ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
                          auStack_138,memory_04);
      pLVar30 = Flow::getSingleValue((Flow *)auStack_378);
      wasm::Literal::Literal((Literal *)auStack_1a8,pLVar30);
      start.breakTo.super_IString.str._M_str = (char *)(curr + 3);
      if (length.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 == 2) {
        iVar17 = Literal::geti32((Literal *)auStack_1a8);
        uVar58 = (uint64_t)iVar17;
      }
      else {
        uVar58 = Literal::geti64((Literal *)auStack_1a8);
      }
      uVar55 = AVar34.addr * 0x10000;
      ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::trapIfGt
                ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)auVar52,
                 *(uint64_t *)(curr + 1),uVar55,"offset > memory");
      ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::trapIfGt
                ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)auVar52,uVar58,
                 uVar55 - *(long *)(curr + 1),"final > memory");
      lVar56 = *(long *)(curr + 1);
      ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::trapIfGt
                ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)auVar52,
                 (ulong)uVar50,uVar55,"bytes > memory");
      ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::checkLoadAddress
                ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)auVar52,
                 (Address)(uVar58 + lVar56),uVar50,AVar34);
      wasm::Literal::~Literal((Literal *)auStack_1a8);
      memoryName_00.super_IString.str._M_str =
           (char *)contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64;
      memoryName_00.super_IString.str._M_len =
           contents.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
      ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::doAtomicLoad
                ((Literal *)auStack_158,
                 (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)auVar52,
                 (Address)(uVar58 + lVar56),uVar50,
                 (Type)*(uintptr_t *)start.breakTo.super_IString.str._M_str,memoryName_00,AVar34);
      pLVar30 = Flow::getSingleValue((Flow *)auStack_98);
      cVar16 = wasm::Literal::operator!=((Literal *)auStack_158,pLVar30);
      if (cVar16 == '\0') {
        Flow::getSingleValue((Flow *)auStack_e8);
        lVar56 = wasm::Literal::getInteger();
        if (lVar56 != 0) {
          (*this->_vptr_ExpressionRunner[3])(this,"threads support");
        }
        auStack_1c8._0_4_ = 2;
        destData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
        Flow::Flow(__return_storage_ptr__,(Literal *)auStack_1c8);
      }
      else {
        auStack_1c8._0_4_ = 1;
        destData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
        Flow::Flow(__return_storage_ptr__,(Literal *)auStack_1c8);
      }
      wasm::Literal::~Literal((Literal *)auStack_1c8);
      pLVar30 = (Literal *)auStack_158;
      goto LAB_00140850;
    }
    Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    break;
  case AtomicNotifyId:
    visit((Flow *)auStack_378,this,(Expression *)curr[1].type.id);
    if (ref.breakTo.super_IString.str._M_len != 0) {
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
      break;
    }
    visit((Flow *)auStack_98,this,*(Expression **)(curr + 2));
    if (start.breakTo.super_IString.str._M_len != 0) {
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_98);
      goto LAB_00140861;
    }
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::getMemoryInstanceInfo
              ((MemoryInstanceInfo *)auStack_e8,
               (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
               (IString)*(IString *)&curr[2].type);
    auVar52 = auStack_e8;
    memory_10.super_IString.str._M_str =
         (char *)end.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64;
    memory_10.super_IString.str._M_len = end.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
    AVar34 = ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::getMemorySize
                       ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)auStack_e8,
                        memory_10);
    pLVar30 = Flow::getSingleValue((Flow *)auStack_378);
    wasm::Literal::Literal((Literal *)auStack_138,pLVar30);
    if (contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 == 2) {
      iVar17 = Literal::geti32((Literal *)auStack_138);
      uVar58 = (uint64_t)iVar17;
    }
    else {
      uVar58 = Literal::geti64((Literal *)auStack_138);
    }
    uVar55 = AVar34.addr * 0x10000;
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::trapIfGt
              ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)auVar52,
               *(uint64_t *)(curr + 1),uVar55,"offset > memory");
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::trapIfGt
              ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)auVar52,uVar58,
               uVar55 - *(long *)(curr + 1),"final > memory");
    lVar56 = *(long *)(curr + 1);
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::trapIfGt
              ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)auVar52,4,uVar55,
               "bytes > memory");
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::checkLoadAddress
              ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)auVar52,
               (Address)(uVar58 + lVar56),4,AVar34);
    wasm::Literal::~Literal((Literal *)auStack_138);
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::checkAtomicAddress
              ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)auVar52,
               (Address)(uVar58 + lVar56),4,AVar34);
    auStack_1a8 = (undefined1  [8])((ulong)(uint)auStack_1a8._4_4_ << 0x20);
    length.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 2;
    Flow::Flow(__return_storage_ptr__,(Literal *)auStack_1a8);
    pLVar30 = (Literal *)auStack_1a8;
    goto LAB_0013f856;
  case SIMDExtractId:
    visit((Flow *)auStack_378,this,(Expression *)curr[1].type.id);
    if (ref.breakTo.super_IString.str._M_len == 0) {
      pLVar30 = Flow::getSingleValue((Flow *)auStack_378);
      wasm::Literal::Literal((Literal *)auStack_98,pLVar30);
      switch(*(undefined4 *)(curr + 1)) {
      case 0:
        wasm::Literal::extractLaneSI8x16((uchar)(Literal *)auStack_e8);
        Flow::Flow(__return_storage_ptr__,(Literal *)auStack_e8);
        break;
      case 1:
        wasm::Literal::extractLaneUI8x16((uchar)(Literal *)auStack_e8);
        Flow::Flow(__return_storage_ptr__,(Literal *)auStack_e8);
        break;
      case 2:
        wasm::Literal::extractLaneSI16x8((uchar)(Literal *)auStack_e8);
        Flow::Flow(__return_storage_ptr__,(Literal *)auStack_e8);
        break;
      case 3:
        wasm::Literal::extractLaneUI16x8((uchar)(Literal *)auStack_e8);
        Flow::Flow(__return_storage_ptr__,(Literal *)auStack_e8);
        break;
      case 4:
        wasm::Literal::extractLaneI32x4((uchar)(Literal *)auStack_e8);
        Flow::Flow(__return_storage_ptr__,(Literal *)auStack_e8);
        break;
      case 5:
        wasm::Literal::extractLaneI64x2((uchar)(Literal *)auStack_e8);
        Flow::Flow(__return_storage_ptr__,(Literal *)auStack_e8);
        break;
      case 6:
        wasm::Literal::extractLaneF16x8((uchar)(Literal *)auStack_e8);
        Flow::Flow(__return_storage_ptr__,(Literal *)auStack_e8);
        break;
      case 7:
        wasm::Literal::extractLaneF32x4((uchar)(Literal *)auStack_e8);
        Flow::Flow(__return_storage_ptr__,(Literal *)auStack_e8);
        break;
      case 8:
        wasm::Literal::extractLaneF64x2((uchar)(Literal *)auStack_e8);
        Flow::Flow(__return_storage_ptr__,(Literal *)auStack_e8);
        break;
      default:
        wasm::handle_unreachable
                  ("invalid op",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                   ,0x4b8);
      }
      pLVar30 = (Literal *)auStack_e8;
      goto LAB_0013f014;
    }
    Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    break;
  case SIMDReplaceId:
    visit((Flow *)auStack_378,this,(Expression *)curr[1].type.id);
    if (ref.breakTo.super_IString.str._M_len != 0) {
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
      break;
    }
    pLVar30 = Flow::getSingleValue((Flow *)auStack_378);
    wasm::Literal::Literal((Literal *)auStack_e8,pLVar30);
    visit((Flow *)auStack_98,this,(Expression *)curr[2].type.id);
    Flow::operator=((Flow *)auStack_378,(Flow *)auStack_98);
    SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)auStack_98);
    if (ref.breakTo.super_IString.str._M_len != 0) {
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
      goto LAB_00140a83;
    }
    pLVar30 = Flow::getSingleValue((Flow *)auStack_378);
    wasm::Literal::Literal((Literal *)auStack_98,pLVar30);
    switch(*(undefined4 *)(curr + 1)) {
    case 0:
      wasm::Literal::replaceLaneI8x16((Literal *)auStack_138,(uchar)auStack_e8);
      Flow::Flow(__return_storage_ptr__,(Literal *)auStack_138);
      break;
    case 1:
      wasm::Literal::replaceLaneI16x8((Literal *)auStack_138,(uchar)auStack_e8);
      Flow::Flow(__return_storage_ptr__,(Literal *)auStack_138);
      break;
    case 2:
      wasm::Literal::replaceLaneI32x4((Literal *)auStack_138,(uchar)auStack_e8);
      Flow::Flow(__return_storage_ptr__,(Literal *)auStack_138);
      break;
    case 3:
      wasm::Literal::replaceLaneI64x2((Literal *)auStack_138,(uchar)auStack_e8);
      Flow::Flow(__return_storage_ptr__,(Literal *)auStack_138);
      break;
    case 4:
      wasm::Literal::replaceLaneF16x8((Literal *)auStack_138,(uchar)auStack_e8);
      Flow::Flow(__return_storage_ptr__,(Literal *)auStack_138);
      break;
    case 5:
      wasm::Literal::replaceLaneF32x4((Literal *)auStack_138,(uchar)auStack_e8);
      Flow::Flow(__return_storage_ptr__,(Literal *)auStack_138);
      break;
    case 6:
      wasm::Literal::replaceLaneF64x2((Literal *)auStack_138,(uchar)auStack_e8);
      Flow::Flow(__return_storage_ptr__,(Literal *)auStack_138);
      break;
    default:
      wasm::handle_unreachable
                ("invalid op",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                 ,0x4d6);
    }
LAB_0014022e:
    wasm::Literal::~Literal((Literal *)auStack_138);
LAB_00140233:
    pLVar30 = (Literal *)auStack_98;
    goto LAB_00140a7e;
  case SIMDShuffleId:
    visit((Flow *)auStack_378,this,*(Expression **)(curr + 1));
    if (ref.breakTo.super_IString.str._M_len != 0) {
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
      break;
    }
    pLVar30 = Flow::getSingleValue((Flow *)auStack_378);
    wasm::Literal::Literal((Literal *)auStack_e8,pLVar30);
    visit((Flow *)auStack_98,this,(Expression *)curr[1].type.id);
    Flow::operator=((Flow *)auStack_378,(Flow *)auStack_98);
    SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)auStack_98);
    if (ref.breakTo.super_IString.str._M_len == 0) {
      pLVar30 = Flow::getSingleValue((Flow *)auStack_378);
      wasm::Literal::Literal((Literal *)auStack_98,pLVar30);
      wasm::Literal::shuffleV8x16((Literal *)auStack_138,(array *)auStack_e8);
      Flow::Flow(__return_storage_ptr__,(Literal *)auStack_138);
      goto LAB_0014022e;
    }
    Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    goto LAB_00140a83;
  case SIMDTernaryId:
    visit((Flow *)auStack_378,this,(Expression *)curr[1].type.id);
    if (ref.breakTo.super_IString.str._M_len != 0) {
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
      break;
    }
    pLVar30 = Flow::getSingleValue((Flow *)auStack_378);
    wasm::Literal::Literal((Literal *)auStack_e8,pLVar30);
    visit((Flow *)auStack_98,this,*(Expression **)(curr + 2));
    Flow::operator=((Flow *)auStack_378,(Flow *)auStack_98);
    SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)auStack_98);
    if (ref.breakTo.super_IString.str._M_len != 0) {
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
      goto LAB_00140a83;
    }
    pLVar30 = Flow::getSingleValue((Flow *)auStack_378);
    wasm::Literal::Literal((Literal *)auStack_138,pLVar30);
    visit((Flow *)auStack_98,this,(Expression *)curr[2].type.id);
    Flow::operator=((Flow *)auStack_378,(Flow *)auStack_98);
    SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)auStack_98);
    if (ref.breakTo.super_IString.str._M_len != 0) {
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
      goto LAB_00140a77;
    }
    pLVar30 = Flow::getSingleValue((Flow *)auStack_378);
    wasm::Literal::Literal((Literal *)auStack_98,pLVar30);
    switch(*(undefined4 *)(curr + 1)) {
    case 0:
    case 7:
    case 8:
    case 9:
    case 10:
      wasm::Literal::bitselectV128((Literal *)auStack_1a8,(Literal *)auStack_98);
      Flow::Flow(__return_storage_ptr__,(Literal *)auStack_1a8);
      break;
    case 1:
      if (this->relaxedBehavior != NonConstant) {
        wasm::Literal::relaxedMaddF16x8((Literal *)auStack_1a8,(Literal *)auStack_e8);
        Flow::Flow(__return_storage_ptr__,(Literal *)auStack_1a8);
        break;
      }
LAB_00140a46:
      sVar28 = CONCAT44(NONCONSTANT_FLOW._4_4_,(undefined4)NONCONSTANT_FLOW);
      pcVar54 = (char *)CONCAT44(uRam0000000000181fd4,_extendLowUToI32x4);
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
      field_0.func.super_IString.str._M_str = (char *)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.
      id = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
      field_0.i64 = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_len = sVar28;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str = pcVar54;
      goto LAB_00140a6b;
    case 2:
      if (this->relaxedBehavior == NonConstant) goto LAB_00140a46;
      wasm::Literal::relaxedNmaddF16x8((Literal *)auStack_1a8,(Literal *)auStack_e8);
      Flow::Flow(__return_storage_ptr__,(Literal *)auStack_1a8);
      break;
    case 3:
      if (this->relaxedBehavior == NonConstant) goto LAB_00140a46;
      wasm::Literal::relaxedMaddF32x4((Literal *)auStack_1a8,(Literal *)auStack_e8);
      Flow::Flow(__return_storage_ptr__,(Literal *)auStack_1a8);
      break;
    case 4:
      if (this->relaxedBehavior == NonConstant) goto LAB_00140a46;
      wasm::Literal::relaxedNmaddF32x4((Literal *)auStack_1a8,(Literal *)auStack_e8);
      Flow::Flow(__return_storage_ptr__,(Literal *)auStack_1a8);
      break;
    case 5:
      if (this->relaxedBehavior == NonConstant) goto LAB_00140a46;
      wasm::Literal::relaxedMaddF64x2((Literal *)auStack_1a8,(Literal *)auStack_e8);
      Flow::Flow(__return_storage_ptr__,(Literal *)auStack_1a8);
      break;
    case 6:
      if (this->relaxedBehavior == NonConstant) goto LAB_00140a46;
      wasm::Literal::relaxedNmaddF64x2((Literal *)auStack_1a8,(Literal *)auStack_e8);
      Flow::Flow(__return_storage_ptr__,(Literal *)auStack_1a8);
      break;
    case 0xb:
      if (this->relaxedBehavior == NonConstant) goto LAB_00140a46;
      wasm::Literal::dotSI8x16toI16x8Add((Literal *)auStack_1a8,(Literal *)auStack_e8);
      Flow::Flow(__return_storage_ptr__,(Literal *)auStack_1a8);
      break;
    default:
      wasm::handle_unreachable
                ("invalid op",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                 ,0x523);
    }
    wasm::Literal::~Literal((Literal *)auStack_1a8);
LAB_00140a6b:
    wasm::Literal::~Literal((Literal *)auStack_98);
    goto LAB_00140a77;
  case SIMDShiftId:
    visit((Flow *)auStack_378,this,(Expression *)curr[1].type.id);
    if (ref.breakTo.super_IString.str._M_len == 0) {
      pLVar30 = Flow::getSingleValue((Flow *)auStack_378);
      wasm::Literal::Literal((Literal *)auStack_e8,pLVar30);
      visit((Flow *)auStack_98,this,*(Expression **)(curr + 2));
      Flow::operator=((Flow *)auStack_378,(Flow *)auStack_98);
      SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)auStack_98);
      if (ref.breakTo.super_IString.str._M_len == 0) {
        pLVar30 = Flow::getSingleValue((Flow *)auStack_378);
        wasm::Literal::Literal((Literal *)auStack_98,pLVar30);
        switch(*(undefined4 *)(curr + 1)) {
        case 0:
          wasm::Literal::shlI8x16((Literal *)auStack_138);
          Flow::Flow(__return_storage_ptr__,(Literal *)auStack_138);
          break;
        case 1:
          wasm::Literal::shrSI8x16((Literal *)auStack_138);
          Flow::Flow(__return_storage_ptr__,(Literal *)auStack_138);
          break;
        case 2:
          wasm::Literal::shrUI8x16((Literal *)auStack_138);
          Flow::Flow(__return_storage_ptr__,(Literal *)auStack_138);
          break;
        case 3:
          wasm::Literal::shlI16x8((Literal *)auStack_138);
          Flow::Flow(__return_storage_ptr__,(Literal *)auStack_138);
          break;
        case 4:
          wasm::Literal::shrSI16x8((Literal *)auStack_138);
          Flow::Flow(__return_storage_ptr__,(Literal *)auStack_138);
          break;
        case 5:
          wasm::Literal::shrUI16x8((Literal *)auStack_138);
          Flow::Flow(__return_storage_ptr__,(Literal *)auStack_138);
          break;
        case 6:
          wasm::Literal::shlI32x4((Literal *)auStack_138);
          Flow::Flow(__return_storage_ptr__,(Literal *)auStack_138);
          break;
        case 7:
          wasm::Literal::shrSI32x4((Literal *)auStack_138);
          Flow::Flow(__return_storage_ptr__,(Literal *)auStack_138);
          break;
        case 8:
          wasm::Literal::shrUI32x4((Literal *)auStack_138);
          Flow::Flow(__return_storage_ptr__,(Literal *)auStack_138);
          break;
        case 9:
          wasm::Literal::shlI64x2((Literal *)auStack_138);
          Flow::Flow(__return_storage_ptr__,(Literal *)auStack_138);
          break;
        case 10:
          wasm::Literal::shrSI64x2((Literal *)auStack_138);
          Flow::Flow(__return_storage_ptr__,(Literal *)auStack_138);
          break;
        case 0xb:
          wasm::Literal::shrUI64x2((Literal *)auStack_138);
          Flow::Flow(__return_storage_ptr__,(Literal *)auStack_138);
          break;
        default:
          wasm::handle_unreachable
                    ("invalid op",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                     ,0x54b);
        }
        goto LAB_0014022e;
      }
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
      goto LAB_00140a83;
    }
    Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    break;
  case SIMDLoadId:
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitSIMDLoad
              (__return_storage_ptr__,
               (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
               (SIMDLoad *)curr);
    goto LAB_00140a9b;
  case SIMDLoadStoreLaneId:
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::visitSIMDLoadStoreLane
              (__return_storage_ptr__,
               (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
               (SIMDLoadStoreLane *)curr);
    goto LAB_00140a9b;
  case MemoryInitId:
    visit((Flow *)auStack_378,this,*(Expression **)(curr + 2));
    if (ref.breakTo.super_IString.str._M_len == 0) {
      visit((Flow *)auStack_98,this,(Expression *)curr[2].type.id);
      if (start.breakTo.super_IString.str._M_len == 0) {
        visit((Flow *)auStack_e8,this,*(Expression **)(curr + 3));
        if (end.breakTo.super_IString.str._M_len == 0) {
          NVar77.super_IString.str._M_str = *(char **)(curr + 1);
          NVar77.super_IString.str._M_len = (size_t)this[1]._vptr_ExpressionRunner;
          lVar56 = wasm::Module::getDataSegment(NVar77);
          Flow::getSingleValue((Flow *)auStack_378);
          pMVar35 = (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
                    wasm::Literal::getUnsigned();
          Flow::getSingleValue((Flow *)auStack_98);
          lVar31 = wasm::Literal::getUnsigned();
          Flow::getSingleValue((Flow *)auStack_e8);
          pcVar54 = (char *)wasm::Literal::getUnsigned();
          if ((pcVar54 + lVar31 != (char *)0x0) &&
             (sVar46 = std::
                       _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                *)&this[4].maxDepth,(key_type *)(curr + 1)), sVar46 != 0)) {
            (*this->_vptr_ExpressionRunner[2])(this,"out of bounds segment access in memory.init");
          }
          if ((char *)(*(long *)(lVar56 + 0x40) - *(long *)(lVar56 + 0x38)) < pcVar54 + lVar31) {
            (*this->_vptr_ExpressionRunner[2])(this,"out of bounds segment access in memory.init");
          }
          ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::getMemoryInstanceInfo
                    ((MemoryInstanceInfo *)auStack_138,
                     (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                     (IString)*(IString *)&curr[3].type);
          uVar26 = contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64;
          sVar28 = contents.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
          auVar52 = auStack_138;
          memory_05.super_IString.str._M_str =
               (char *)contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64;
          memory_05.super_IString.str._M_len =
               contents.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
          AVar38 = ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::getMemorySize
                             ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
                              auStack_138,memory_05);
          AVar34.addr = AVar38.addr << 0x10;
          if (AVar34.addr < pcVar54 + (long)pMVar35) {
            (*this->_vptr_ExpressionRunner[2])(this,"out of bounds memory access in memory.init");
          }
          while (pcVar54 != (char *)0x0) {
            length.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 3;
            pEVar8 = *(ExternalInterface **)((long)auVar52 + 0x200);
            auStack_1a8 = (undefined1  [8])pMVar35;
            end.breakTo.super_IString.str._M_str = (char *)pMVar35;
            start.breakTo.super_IString.str._M_str = pcVar54 + -1;
            wasm::Literal::Literal((Literal *)auStack_158,(Literal *)auStack_1a8);
            AVar42 = ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::
                     getFinalAddressWithoutOffset
                               ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
                                auVar52,(Literal *)auStack_158,(Index)AVar38.addr,AVar34);
            AVar34.addr = sVar28;
            (*pEVar8->_vptr_ExternalInterface[0x16])
                      (pEVar8,AVar42.addr,
                       (ulong)(uint)(int)*(char *)(*(long *)(lVar56 + 0x38) + lVar31),sVar28,uVar26)
            ;
            wasm::Literal::~Literal((Literal *)auStack_158);
            wasm::Literal::~Literal((Literal *)auStack_1a8);
            lVar31 = lVar31 + 1;
            pMVar35 = (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
                      (end.breakTo.super_IString.str._M_str + 1);
            pcVar54 = start.breakTo.super_IString.str._M_str;
          }
LAB_0013eadc:
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.func.super_IString.str._M_str = (char *)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          type.id = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.i64 = 0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
        }
        else {
          Flow::Flow(__return_storage_ptr__,(Flow *)auStack_e8);
        }
        goto LAB_00140855;
      }
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_98);
      goto LAB_00140861;
    }
    Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    break;
  case DataDropId:
    std::__detail::
    _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::insert((_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)&this[4].maxDepth,(value_type *)(curr + 1));
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0
    .i64 = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0
    .func.super_IString.str._M_str = (char *)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id
         = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
LAB_001398f1:
    (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
    goto LAB_00140a9b;
  case MemoryCopyId:
    visit((Flow *)auStack_378,this,*(Expression **)(curr + 1));
    if (ref.breakTo.super_IString.str._M_len == 0) {
      visit((Flow *)auStack_98,this,(Expression *)curr[1].type.id);
      if (start.breakTo.super_IString.str._M_len == 0) {
        visit((Flow *)auStack_e8,this,*(Expression **)(curr + 2));
        if (end.breakTo.super_IString.str._M_len == 0) {
          Flow::getSingleValue((Flow *)auStack_378);
          pcVar60 = (char *)wasm::Literal::getUnsigned();
          Flow::getSingleValue((Flow *)auStack_98);
          end.breakTo.super_IString.str._M_str = (char *)wasm::Literal::getUnsigned();
          Flow::getSingleValue((Flow *)auStack_e8);
          pcVar54 = (char *)wasm::Literal::getUnsigned();
          ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::getMemoryInstanceInfo
                    ((MemoryInstanceInfo *)auStack_138,
                     (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                     (IString)*(IString *)&curr[2].type);
          ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::getMemoryInstanceInfo
                    ((MemoryInstanceInfo *)auStack_1a8,
                     (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                     (IString)*(IString *)&curr[3].type);
          auVar52 = auStack_138;
          memory_06.super_IString.str._M_str =
               (char *)contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64;
          memory_06.super_IString.str._M_len =
               contents.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
          local_3e8 = contents.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
          local_3e0 = contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64;
          AVar34 = ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::getMemorySize
                             ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
                              auStack_138,memory_06);
          memory_00.super_IString.str._M_str =
               (char *)length.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0
                       .i64;
          memory_00.super_IString.str._M_len =
               length.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
          local_3b8 = (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)auStack_1a8;
          local_3b0 = length.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
          local_3f0 = length.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.
                      i64;
          AVar38 = ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::getMemorySize
                             ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
                              auStack_1a8,memory_00);
          if (((((char *)(AVar38.addr << 0x10) <
                 end.breakTo.super_IString.str._M_str + (long)pcVar54) ||
               (CARRY8((ulong)pcVar54,(ulong)pcVar60))) ||
              (end.breakTo.super_IString.str._M_str + (long)pcVar54 <
               end.breakTo.super_IString.str._M_str)) ||
             ((char *)(AVar34.addr << 0x10) < pcVar54 + (long)pcVar60)) {
            (*this->_vptr_ExpressionRunner[2])(this,"out of bounds segment access in memory.copy");
          }
          pcVar57 = (char *)0x0;
          if (end.breakTo.super_IString.str._M_str < pcVar60) {
            pcVar57 = pcVar54 + -1;
            pcVar54 = (char *)0xffffffffffffffff;
          }
          local_3d8 = -(ulong)(end.breakTo.super_IString.str._M_str < pcVar60) | 1;
          AVar42.addr = (address64_t)pcVar60;
          while (pcVar54 != pcVar57) {
            pEVar8 = *(ExternalInterface **)((long)auVar52 + 0x200);
            auStack_158 = (undefined1  [8])(pcVar60 + (long)pcVar57);
            refData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3;
            AVar41 = ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::
                     getFinalAddressWithoutOffset
                               ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
                                auVar52,(Literal *)auStack_158,(Index)AVar34.addr,AVar42);
            pEVar9 = local_3b8->externalInterface;
            auStack_1c8 = (undefined1  [8])(end.breakTo.super_IString.str._M_str + (long)pcVar57);
            destData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3;
            start.breakTo.super_IString.str._M_str = pcVar57;
            AVar42 = ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::
                     getFinalAddressWithoutOffset
                               (local_3b8,(Literal *)auStack_1c8,(Index)AVar38.addr,AVar42);
            iVar18 = (*pEVar9->_vptr_ExternalInterface[0xd])(pEVar9,AVar42.addr,local_3b0,local_3f0)
            ;
            AVar42.addr = local_3e8;
            (*pEVar8->_vptr_ExternalInterface[0x16])
                      (pEVar8,AVar41.addr,(ulong)(uint)(int)(char)iVar18,local_3e8,local_3e0);
            wasm::Literal::~Literal((Literal *)auStack_1c8);
            wasm::Literal::~Literal((Literal *)auStack_158);
            pcVar57 = start.breakTo.super_IString.str._M_str + local_3d8;
          }
          goto LAB_0013eadc;
        }
        Flow::Flow(__return_storage_ptr__,(Flow *)auStack_e8);
        goto LAB_00140855;
      }
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_98);
      goto LAB_00140861;
    }
    Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    break;
  case MemoryFillId:
    visit((Flow *)auStack_378,this,*(Expression **)(curr + 1));
    if (ref.breakTo.super_IString.str._M_len == 0) {
      visit((Flow *)auStack_98,this,(Expression *)curr[1].type.id);
      if (start.breakTo.super_IString.str._M_len == 0) {
        visit((Flow *)auStack_e8,this,*(Expression **)(curr + 2));
        if (end.breakTo.super_IString.str._M_len == 0) {
          Flow::getSingleValue((Flow *)auStack_378);
          pMVar35 = (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
                    wasm::Literal::getUnsigned();
          Flow::getSingleValue((Flow *)auStack_e8);
          pMVar36 = (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
                    wasm::Literal::getUnsigned();
          ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::getMemoryInstanceInfo
                    ((MemoryInstanceInfo *)auStack_138,
                     (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                     (IString)*(IString *)&curr[2].type);
          uVar26 = contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64;
          auVar52 = auStack_138;
          memory_07.super_IString.str._M_str =
               (char *)contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64;
          memory_07.super_IString.str._M_len =
               contents.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
          end.breakTo.super_IString.str._M_str =
               (char *)contents.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
          start.breakTo.super_IString.str._M_str =
               (char *)ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::getMemorySize
                                 ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
                                  auStack_138,memory_07);
          pMVar37 = (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
                    ((long)start.breakTo.super_IString.str._M_str << 0x10);
          AVar34.addr = (long)&(pMVar36->
                               super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>).
                               _vptr_ExpressionRunner + (long)pMVar35;
          if (((pMVar37 < AVar34.addr) || (pMVar37 < pMVar35)) || (pMVar37 < pMVar36)) {
            (*this->_vptr_ExpressionRunner[2])(this,"out of bounds memory access in memory.fill");
          }
          pLVar30 = Flow::getSingleValue((Flow *)auStack_98);
          iVar17 = Literal::geti32(pLVar30);
          while (bVar61 = pMVar36 !=
                          (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)0x0,
                pMVar36 = (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
                          ((long)&pMVar36[-1].linkedInstances._M_t._M_impl.super__Rb_tree_header.
                                  _M_node_count + 7), bVar61) {
            pEVar8 = *(ExternalInterface **)((long)auVar52 + 0x200);
            length.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 3;
            auStack_1a8 = (undefined1  [8])pMVar35;
            AVar38 = ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::
                     getFinalAddressWithoutOffset
                               ((ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
                                auVar52,(Literal *)auStack_1a8,
                                (Index)start.breakTo.super_IString.str._M_str,AVar34);
            AVar34.addr = (address64_t)end.breakTo.super_IString.str._M_str;
            (*pEVar8->_vptr_ExternalInterface[0x16])
                      (pEVar8,AVar38.addr,(ulong)(uint)(int)(char)iVar17,
                       end.breakTo.super_IString.str._M_str,uVar26);
            wasm::Literal::~Literal((Literal *)auStack_1a8);
            pMVar35 = (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
                      ((long)&(pMVar35->
                              super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>).
                              _vptr_ExpressionRunner + 1);
          }
          goto LAB_0013eadc;
        }
        Flow::Flow(__return_storage_ptr__,(Flow *)auStack_e8);
        goto LAB_00140855;
      }
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_98);
      goto LAB_00140861;
    }
    Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    break;
  case PopId:
    if (*(_func_int ***)&this[2].maxLoopIterations == this[3]._vptr_ExpressionRunner) {
      __assert_fail("!multiValues.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                    ,0x114d,
                    "Flow wasm::ModuleRunnerBase<(anonymous namespace)::EvallingModuleRunner>::visitPop(Pop *) [SubType = (anonymous namespace)::EvallingModuleRunner]"
                   );
    }
    SmallVector<wasm::Literal,_1UL>::SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)auStack_378,
               (SmallVector<wasm::Literal,_1UL> *)(this[3]._vptr_ExpressionRunner + -7));
    TVar33 = Literals::getType((Literals *)auStack_378);
    cVar16 = wasm::Type::isSubType(TVar33,(Type)(curr->type).id);
    if (cVar16 == '\0') {
      __assert_fail("Type::isSubType(ret.getType(), curr->type)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                    ,0x114f,
                    "Flow wasm::ModuleRunnerBase<(anonymous namespace)::EvallingModuleRunner>::visitPop(Pop *) [SubType = (anonymous namespace)::EvallingModuleRunner]"
                   );
    }
    std::vector<wasm::Literals,_std::allocator<wasm::Literals>_>::pop_back
              ((vector<wasm::Literals,_std::allocator<wasm::Literals>_> *)&this[2].maxLoopIterations
              );
    Flow::Flow(__return_storage_ptr__,(Literals *)auStack_378);
    break;
  case RefNullId:
    HVar21 = Type::getHeapType(&curr->type);
    Literal::makeNull((Literal *)auStack_378,HVar21);
    Flow::Flow(__return_storage_ptr__,(Literal *)auStack_378);
    goto LAB_0013a312;
  case RefIsNullId:
    visit((Flow *)auStack_378,this,*(Expression **)(curr + 1));
    if (ref.breakTo.super_IString.str._M_len == 0) {
      pLVar30 = Flow::getSingleValue((Flow *)auStack_378);
      auStack_98[0] = Type::isNull(&pLVar30->type);
      auStack_98._1_3_ = 0;
      start.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 2;
      Flow::Flow(__return_storage_ptr__,(Literal *)auStack_98);
      goto LAB_0013f019;
    }
    Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    break;
  case RefFuncId:
    EVar10 = curr[1];
    HVar21 = Type::getHeapType(&curr->type);
    Literal::Literal((Literal *)auStack_378,(Name)EVar10,HVar21);
    Flow::Flow(__return_storage_ptr__,(Literal *)auStack_378);
    goto LAB_0013a312;
  case RefEqId:
    visit((Flow *)auStack_378,this,*(Expression **)(curr + 1));
    if (ref.breakTo.super_IString.str._M_len == 0) {
      pLVar30 = Flow::getSingleValue((Flow *)auStack_378);
      wasm::Literal::Literal((Literal *)auStack_e8,pLVar30);
      visit((Flow *)auStack_98,this,(Expression *)curr[1].type.id);
      Flow::operator=((Flow *)auStack_378,(Flow *)auStack_98);
      SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)auStack_98);
      if (ref.breakTo.super_IString.str._M_len == 0) {
        pLVar30 = Flow::getSingleValue((Flow *)auStack_378);
        wasm::Literal::Literal((Literal *)auStack_98,pLVar30);
        auStack_138[0] = wasm::Literal::operator==((Literal *)auStack_e8,(Literal *)auStack_98);
        auStack_138._1_3_ = 0;
        contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 2;
        Flow::Flow(__return_storage_ptr__,(Literal *)auStack_138);
        goto LAB_0014022e;
      }
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
      goto LAB_00140a83;
    }
    Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    break;
  case TableGetId:
    visit((Flow *)auStack_378,this,*(Expression **)(curr + 2));
    if (ref.breakTo.super_IString.str._M_len == 0) {
      ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::getTableInstanceInfo
                ((TableInstanceInfo *)auStack_98,
                 (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,(Name)curr[1]
                );
      Flow::getSingleValue((Flow *)auStack_378);
      uVar26 = wasm::Literal::getUnsigned();
      (**(code **)(**(long **)((long)auStack_98 + 0x200) + 0xe8))
                (auStack_e8,*(long **)((long)auStack_98 + 0x200),
                 start.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed,
                 start.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64,
                 uVar26);
      Flow::Flow(__return_storage_ptr__,(Literal *)auStack_e8);
      goto LAB_00140a83;
    }
    Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    break;
  case TableSetId:
    visit((Flow *)auStack_378,this,*(Expression **)(curr + 2));
    if (ref.breakTo.super_IString.str._M_len == 0) {
      visit((Flow *)auStack_98,this,(Expression *)curr[2].type.id);
      if (start.breakTo.super_IString.str._M_len == 0) {
        ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::getTableInstanceInfo
                  ((TableInstanceInfo *)auStack_e8,
                   (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                   (Name)curr[1]);
        Flow::getSingleValue((Flow *)auStack_378);
        uVar27 = wasm::Literal::getUnsigned();
        uVar26 = end.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64;
        sVar28 = end.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
        plVar29 = *(long **)&(((Block *)((long)auStack_e8 + 0x200))->
                             super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression;
        pLVar30 = Flow::getSingleValue((Flow *)auStack_98);
        (**(code **)(*plVar29 + 0xe0))(plVar29,sVar28,uVar26,uVar27,pLVar30);
        goto LAB_0013de62;
      }
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_98);
      goto LAB_00140861;
    }
    Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    break;
  case TableSizeId:
    ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::getTableInstanceInfo
              ((TableInstanceInfo *)auStack_378,
               (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,(Name)curr[1]);
    auVar52 = auStack_378;
    NVar70.super_IString.str._M_str =
         (char *)ref.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
    NVar70.super_IString.str._M_len = (size_t)*(Module **)((long)auStack_378 + 0x20);
    lVar56 = wasm::Module::getTable(NVar70);
    uVar50 = (*(*(ExternalInterface **)((long)auVar52 + 0x200))->_vptr_ExternalInterface[0x1b])
                       (*(ExternalInterface **)((long)auVar52 + 0x200),*(undefined8 *)(curr + 1),
                        curr[1].type.id);
    Literal::makeFromInt64((Literal *)auStack_98,(ulong)uVar50,(Type)*(uintptr_t *)(lVar56 + 0x48));
    Flow::Flow(__return_storage_ptr__,(Literal *)auStack_98);
LAB_0013a2e2:
    pLVar30 = (Literal *)auStack_98;
    goto LAB_0013a319;
  case TableGrowId:
    visit((Flow *)auStack_378,this,*(Expression **)(curr + 2));
    if (ref.breakTo.super_IString.str._M_len == 0) {
      visit((Flow *)auStack_98,this,(Expression *)curr[2].type.id);
      if (start.breakTo.super_IString.str._M_len != 0) {
        Flow::Flow(__return_storage_ptr__,(Flow *)auStack_98);
        goto LAB_00140861;
      }
      ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::getTableInstanceInfo
                ((TableInstanceInfo *)auStack_1a8,
                 (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,(Name)curr[1]
                );
      uVar26 = length.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64;
      sVar28 = length.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
      auVar52 = auStack_1a8;
      uVar50 = (*(*(ExternalInterface **)((long)auStack_1a8 + 0x200))->_vptr_ExternalInterface[0x1b]
               )(*(ExternalInterface **)((long)auStack_1a8 + 0x200),
                 length.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed,
                 length.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64);
      start.breakTo.super_IString.str._M_str = (char *)sVar28;
      NVar75.super_IString.str._M_str = (char *)sVar28;
      NVar75.super_IString.str._M_len =
           (((Literals *)((long)auVar52 + 8))->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems
           [0].type.id;
      lVar56 = wasm::Module::getTable(NVar75);
      end.breakTo.super_IString.str._M_str =
           (char *)CONCAT44(end.breakTo.super_IString.str._M_str._4_4_,uVar50);
      uVar32 = (ulong)uVar50;
      Literal::makeFromInt64((Literal *)auStack_158,uVar32,(Type)*(uintptr_t *)(lVar56 + 0x48));
      Flow::Flow((Flow *)auStack_e8,(Literal *)auStack_158);
      wasm::Literal::~Literal((Literal *)auStack_158);
      Literal::makeFromInt64((Literal *)auStack_1c8,-1,(Type)*(uintptr_t *)(lVar56 + 0x48));
      Flow::Flow((Flow *)auStack_138,(Literal *)auStack_1c8);
      wasm::Literal::~Literal((Literal *)auStack_1c8);
      Flow::getSingleValue((Flow *)auStack_98);
      uVar59 = wasm::Literal::getUnsigned();
      uVar45 = uVar32 + uVar59;
      pFVar53 = (Flow *)auStack_138;
      if (((!CARRY8(uVar32,uVar59)) && (uVar45 < 0x989681)) && (uVar45 <= *(ulong *)(lVar56 + 0x40))
         ) {
        pEVar8 = *(ExternalInterface **)((long)auVar52 + 0x200);
        pLVar30 = Flow::getSingleValue((Flow *)auStack_378);
        iVar18 = (*pEVar8->_vptr_ExternalInterface[7])
                           (pEVar8,start.breakTo.super_IString.str._M_str,uVar26,pLVar30,
                            (ulong)end.breakTo.super_IString.str._M_str & 0xffffffff,
                            uVar45 & 0xffffffff);
        if ((char)iVar18 != '\0') {
          pFVar53 = (Flow *)auStack_e8;
        }
      }
      Flow::Flow(__return_storage_ptr__,pFVar53);
LAB_001406ba:
      SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)auStack_138);
      goto LAB_00140855;
    }
    Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    break;
  case TableFillId:
    visit((Flow *)auStack_378,this,*(Expression **)(curr + 2));
    if (ref.breakTo.super_IString.str._M_len == 0) {
      visit((Flow *)auStack_98,this,(Expression *)curr[2].type.id);
      if (start.breakTo.super_IString.str._M_len == 0) {
        visit((Flow *)auStack_e8,this,*(Expression **)(curr + 3));
        if (end.breakTo.super_IString.str._M_len == 0) {
          ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::getTableInstanceInfo
                    ((TableInstanceInfo *)auStack_138,
                     (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                     (Name)curr[1]);
          Flow::getSingleValue((Flow *)auStack_378);
          lVar56 = wasm::Literal::getUnsigned();
          pLVar30 = Flow::getSingleValue((Flow *)auStack_98);
          wasm::Literal::Literal((Literal *)auStack_1a8,pLVar30);
          Flow::getSingleValue((Flow *)auStack_e8);
          lVar31 = wasm::Literal::getUnsigned();
          uVar26 = contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64;
          sVar28 = contents.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
          auVar52 = auStack_138;
          uVar50 = (*(*(ExternalInterface **)((long)auStack_138 + 0x200))->_vptr_ExternalInterface
                     [0x1b])(*(ExternalInterface **)((long)auStack_138 + 0x200),
                             contents.super_SmallVector<wasm::Literal,_1UL>.usedFixed,
                             contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
                             field_0.i64);
          if ((ulong)uVar50 < (ulong)(lVar31 + lVar56)) {
            (*this->_vptr_ExpressionRunner[2])(this,"out of bounds table access");
          }
          while (bVar61 = lVar31 != 0, lVar31 = lVar31 + -1, bVar61) {
            (*(*(ExternalInterface **)((long)auVar52 + 0x200))->_vptr_ExternalInterface[0x1c])
                      (*(ExternalInterface **)((long)auVar52 + 0x200),sVar28,uVar26,lVar56,
                       auStack_1a8);
            lVar56 = lVar56 + 1;
          }
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.func.super_IString.str._M_str = (char *)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          type.id = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.i64 = 0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
          pLVar30 = (Literal *)auStack_1a8;
          goto LAB_00140850;
        }
        Flow::Flow(__return_storage_ptr__,(Flow *)auStack_e8);
        goto LAB_00140855;
      }
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_98);
      goto LAB_00140861;
    }
    Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    break;
  case TableCopyId:
    visit((Flow *)auStack_378,this,*(Expression **)(curr + 1));
    if (ref.breakTo.super_IString.str._M_len == 0) {
      visit((Flow *)auStack_98,this,(Expression *)curr[1].type.id);
      if (start.breakTo.super_IString.str._M_len == 0) {
        visit((Flow *)auStack_e8,this,*(Expression **)(curr + 2));
        if (end.breakTo.super_IString.str._M_len == 0) {
          Flow::getSingleValue((Flow *)auStack_378);
          end.breakTo.super_IString.str._M_str = (char *)wasm::Literal::getUnsigned();
          Flow::getSingleValue((Flow *)auStack_98);
          start.breakTo.super_IString.str._M_str = (char *)wasm::Literal::getUnsigned();
          Flow::getSingleValue((Flow *)auStack_e8);
          pcVar54 = (char *)wasm::Literal::getUnsigned();
          ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::getTableInstanceInfo
                    ((TableInstanceInfo *)auStack_138,
                     (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                     (IString)*(IString *)&curr[2].type);
          ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::getTableInstanceInfo
                    ((TableInstanceInfo *)auStack_1a8,
                     (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                     (IString)*(IString *)&curr[3].type);
          auVar13 = auStack_138;
          local_3b8 = (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)
                      contents.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
          local_3b0 = contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64;
          uVar50 = (*(*(ExternalInterface **)((long)auStack_138 + 0x200))->_vptr_ExternalInterface
                     [0x1b])();
          uVar26 = length.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64
          ;
          sVar28 = length.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
          auVar52 = auStack_1a8;
          uVar19 = (*(*(ExternalInterface **)((long)auStack_1a8 + 0x200))->_vptr_ExternalInterface
                     [0x1b])();
          if (((((char *)(ulong)uVar19 < start.breakTo.super_IString.str._M_str + (long)pcVar54) ||
               (CARRY8((ulong)pcVar54,(ulong)end.breakTo.super_IString.str._M_str))) ||
              (start.breakTo.super_IString.str._M_str + (long)pcVar54 <
               start.breakTo.super_IString.str._M_str)) ||
             ((char *)(ulong)uVar50 < pcVar54 + (long)end.breakTo.super_IString.str._M_str)) {
            (*this->_vptr_ExpressionRunner[2])(this,"out of bounds segment access in table.copy");
          }
          pcVar60 = (char *)0x0;
          bVar61 = start.breakTo.super_IString.str._M_str < end.breakTo.super_IString.str._M_str;
          if (start.breakTo.super_IString.str._M_str < end.breakTo.super_IString.str._M_str) {
            pcVar60 = pcVar54 + -1;
            pcVar54 = (char *)0xffffffffffffffff;
          }
          for (; pcVar54 != pcVar60; pcVar60 = pcVar60 + (-(ulong)bVar61 | 1)) {
            pEVar8 = *(ExternalInterface **)((long)auVar13 + 0x200);
            (*(*(ExternalInterface **)((long)auVar52 + 0x200))->_vptr_ExternalInterface[0x1d])
                      ((Literal *)auStack_158,*(ExternalInterface **)((long)auVar52 + 0x200),sVar28,
                       uVar26,start.breakTo.super_IString.str._M_str + (long)pcVar60);
            (*pEVar8->_vptr_ExternalInterface[0x1c])
                      (pEVar8,local_3b8,local_3b0,
                       end.breakTo.super_IString.str._M_str + (long)pcVar60,(Literal *)auStack_158);
            wasm::Literal::~Literal((Literal *)auStack_158);
          }
          goto LAB_0013eadc;
        }
        Flow::Flow(__return_storage_ptr__,(Flow *)auStack_e8);
        goto LAB_00140855;
      }
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_98);
      goto LAB_00140861;
    }
    Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    break;
  case TableInitId:
    visit((Flow *)auStack_378,this,*(Expression **)(curr + 2));
    if (ref.breakTo.super_IString.str._M_len == 0) {
      visit((Flow *)auStack_98,this,(Expression *)curr[2].type.id);
      if (start.breakTo.super_IString.str._M_len == 0) {
        visit((Flow *)auStack_e8,this,*(Expression **)(curr + 3));
        if (end.breakTo.super_IString.str._M_len == 0) {
          NVar78.super_IString.str._M_str = *(char **)(curr + 1);
          NVar78.super_IString.str._M_len = (size_t)this[1]._vptr_ExpressionRunner;
          start.breakTo.super_IString.str._M_str = (char *)wasm::Module::getElementSegment(NVar78);
          Flow::getSingleValue((Flow *)auStack_378);
          lVar56 = wasm::Literal::getUnsigned();
          pLVar30 = Flow::getSingleValue((Flow *)auStack_98);
          uVar50 = Literal::geti32(pLVar30);
          pLVar30 = Flow::getSingleValue((Flow *)auStack_e8);
          uVar19 = Literal::geti32(pLVar30);
          uVar32 = (ulong)uVar50;
          uVar59 = (ulong)uVar19;
          if ((uVar32 + uVar59 != 0) &&
             (sVar46 = std::
                       _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                *)&this[6].module,(key_type *)(curr + 1)), sVar46 != 0)) {
            (*this->_vptr_ExpressionRunner[2])(this,"out of bounds segment access in table.init");
          }
          if ((ulong)(*(long *)(start.breakTo.super_IString.str._M_str + 0x40) -
                      *(long *)(start.breakTo.super_IString.str._M_str + 0x38) >> 3) <
              uVar32 + uVar59) {
            (*this->_vptr_ExpressionRunner[2])(this,"out of bounds segment access in table.init");
          }
          ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::getTableInstanceInfo
                    ((TableInstanceInfo *)auStack_1a8,
                     (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,
                     (IString)*(IString *)&curr[3].type);
          uVar26 = length.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64
          ;
          sVar28 = length.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
          end.breakTo.super_IString.str._M_str = (char *)auStack_1a8;
          uVar50 = (*(*(ExternalInterface **)((long)auStack_1a8 + 0x200))->_vptr_ExternalInterface
                     [0x1b])(*(ExternalInterface **)((long)auStack_1a8 + 0x200),
                             length.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed,
                             length.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
                             field_0.i64);
          if ((ulong)uVar50 < lVar56 + uVar59) {
            (*this->_vptr_ExpressionRunner[2])(this,"out of bounds table access in table.init");
          }
          while (bVar61 = uVar59 != 0, uVar59 = uVar59 - 1, bVar61) {
            visit((Flow *)auStack_138,this,
                  *(Expression **)
                   (*(long *)(start.breakTo.super_IString.str._M_str + 0x38) + uVar32 * 8));
            pLVar30 = Flow::getSingleValue((Flow *)auStack_138);
            wasm::Literal::Literal((Literal *)auStack_158,pLVar30);
            SmallVector<wasm::Literal,_1UL>::~SmallVector
                      ((SmallVector<wasm::Literal,_1UL> *)auStack_138);
            (**(code **)(**(long **)(end.breakTo.super_IString.str._M_str + 0x200) + 0xe0))
                      (*(long **)(end.breakTo.super_IString.str._M_str + 0x200),sVar28,uVar26,lVar56
                       ,auStack_158);
            wasm::Literal::~Literal((Literal *)auStack_158);
            uVar32 = uVar32 + 1;
            lVar56 = lVar56 + 1;
          }
          goto LAB_0013eadc;
        }
        Flow::Flow(__return_storage_ptr__,(Flow *)auStack_e8);
        goto LAB_00140855;
      }
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_98);
      goto LAB_00140861;
    }
    Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    break;
  case TryId:
    auStack_e8 = (undefined1  [8])curr;
    visit(__return_storage_ptr__,this,*(Expression **)(curr + 2));
    goto LAB_00140a9b;
  case TryTableId:
    visit(__return_storage_ptr__,this,*(Expression **)(curr + 1));
    goto LAB_00140a9b;
  case ThrowId:
    ref.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    ref.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ref.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
    ref.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.
    str._M_str = (char *)0x0;
    auStack_378 = (undefined1  [8])0x0;
    ref.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    ref.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    generateArguments(__return_storage_ptr__,this,(ExpressionList *)(curr + 2),
                      (Literals *)auStack_378);
    if ((__return_storage_ptr__->breakTo).super_IString.str._M_str == (char *)0x0) {
      auStack_e8 = curr[1]._id;
      end.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed = curr[1].type.id;
      std::make_shared<wasm::ExnData,wasm::Name&,wasm::Literals_const&>
                ((Name *)auStack_138,(Literals *)auStack_e8);
      std::__shared_ptr<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2> *)auStack_1a8,
                 (__shared_ptr<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2> *)auStack_138);
      wasm::Literal::Literal
                ((Literal *)auStack_98,
                 (__shared_ptr<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2> *)auStack_1a8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&length);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&contents);
      (*this->_vptr_ExpressionRunner[4])(this,auStack_98);
      wasm::Literal::~Literal((Literal *)auStack_98);
      wasm::handle_unreachable
                ("throw",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                 ,0x623);
    }
    break;
  case RethrowId:
    lVar56 = (long)this[10]._vptr_ExpressionRunner +
             (*(long *)&this[0xf].maxDepth - (long)this[0xf].module) / 0x28;
    while( true ) {
      lVar56 = lVar56 + -1;
      uVar50 = (uint)lVar56;
      if ((int)uVar50 < 0) break;
      pEVar12 = (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)
                &this[0xf].module[-1].dataSegmentsMap._M_h;
      if (uVar50 < 4) {
        pEVar12 = this + 10;
      }
      if (*(uintptr_t *)((long)pEVar12 + ((ulong)(uVar50 & 0x7fffffff) * 5 + 4) * 8 + 8) ==
          curr[1].type.id) {
        (*this->_vptr_ExpressionRunner[4])();
      }
    }
    wasm::handle_unreachable
              ("rethrow",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
               ,0x1149);
  case ThrowRefId:
    visit(__return_storage_ptr__,this,*(Expression **)(curr + 1));
    if ((__return_storage_ptr__->breakTo).super_IString.str._M_str == (char *)0x0) {
      pLVar30 = Flow::getSingleValue(__return_storage_ptr__);
      bVar61 = Type::isNull(&pLVar30->type);
      if (bVar61) {
        (*this->_vptr_ExpressionRunner[2])(this,"null ref");
      }
      bVar61 = Type::isExn(&pLVar30->type);
      if (!bVar61) {
        __assert_fail("exnref.isExn()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                      ,0x631,
                      "Flow wasm::ExpressionRunner<(anonymous namespace)::EvallingModuleRunner>::visitThrowRef(ThrowRef *) [SubType = (anonymous namespace)::EvallingModuleRunner]"
                     );
      }
      wasm::Literal::Literal((Literal *)auStack_378,pLVar30);
      (*this->_vptr_ExpressionRunner[4])(this,auStack_378);
      wasm::Literal::~Literal((Literal *)auStack_378);
      wasm::handle_unreachable
                ("throw",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                 ,0x633);
    }
    goto LAB_00140a9b;
  case TupleMakeId:
    ref.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    ref.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ref.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
    ref.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.
    str._M_str = (char *)0x0;
    auStack_378 = (undefined1  [8])0x0;
    ref.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    ref.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    generateArguments(__return_storage_ptr__,this,(ExpressionList *)(curr + 1),
                      (Literals *)auStack_378);
    if ((__return_storage_ptr__->breakTo).super_IString.str._M_str == (char *)0x0) {
      IVar66 = (IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                )SmallVector<wasm::Literal,_1UL>::end
                           ((SmallVector<wasm::Literal,_1UL> *)auStack_378);
      lVar56 = -0x18;
      for (sVar28 = 0; IVar11.index = sVar28,
          IVar11.parent = (SmallVector<wasm::Literal,_1UL> *)auStack_378, IVar66 != IVar11;
          sVar28 = sVar28 + 1) {
        pFVar53 = (Flow *)(ref.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.
                           id + lVar56);
        if (sVar28 == 0) {
          pFVar53 = &ref;
        }
        wasm::Literal::Literal((Literal *)auStack_98,(Literal *)pFVar53);
        if (start.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.
            super_IString.str._M_len < 2) {
          __assert_fail("arg.type.isConcrete()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                        ,0x5c6,
                        "Flow wasm::ExpressionRunner<(anonymous namespace)::EvallingModuleRunner>::visitTupleMake(TupleMake *) [SubType = (anonymous namespace)::EvallingModuleRunner]"
                       );
        }
        SmallVector<wasm::Literal,_1UL>::push_back
                  ((SmallVector<wasm::Literal,_1UL> *)__return_storage_ptr__,(Literal *)auStack_98);
        wasm::Literal::~Literal((Literal *)auStack_98);
        lVar56 = lVar56 + 0x18;
      }
    }
    break;
  case TupleExtractId:
    visit((Flow *)auStack_378,this,*(Expression **)(curr + 1));
    if (ref.breakTo.super_IString.str._M_len == 0) {
      uVar59 = (ulong)(uint)curr[1].type.id;
      if ((ulong)((long)((long)ref.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                               super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                               _M_impl.super__Vector_impl_data._M_start -
                        ref.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id)
                  / 0x18 + (long)auStack_378) <= uVar59) {
        __assert_fail("flow.values.size() > curr->index",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                      ,0x5d1,
                      "Flow wasm::ExpressionRunner<(anonymous namespace)::EvallingModuleRunner>::visitTupleExtract(TupleExtract *) [SubType = (anonymous namespace)::EvallingModuleRunner]"
                     );
      }
      pFVar53 = (Flow *)((ref.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id
                         - 0x18) + uVar59 * 0x18);
      if (uVar59 == 0) {
        pFVar53 = &ref;
      }
      wasm::Literal::Literal((Literal *)auStack_98,(Literal *)pFVar53);
      Flow::Flow(__return_storage_ptr__,(Literal *)auStack_98);
      goto LAB_0013f019;
    }
    Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    break;
  case RefI31Id:
    visit((Flow *)auStack_378,this,*(Expression **)(curr + 1));
    if (ref.breakTo.super_IString.str._M_len == 0) {
      pLVar30 = Flow::getSingleValue((Flow *)auStack_378);
      iVar17 = Literal::geti32(pLVar30);
      auStack_e8 = (undefined1  [8])Type::getHeapType(&curr->type);
      share = wasm::HeapType::getShared();
      Literal::makeI31((Literal *)auStack_98,iVar17,share);
      Flow::Flow(__return_storage_ptr__,(Literal *)auStack_98);
      goto LAB_0013f019;
    }
    Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    break;
  case I31GetId:
    visit((Flow *)auStack_378,this,*(Expression **)(curr + 1));
    if (ref.breakTo.super_IString.str._M_len == 0) {
      pLVar30 = Flow::getSingleValue((Flow *)auStack_378);
      bVar61 = Type::isNull(&pLVar30->type);
      if (bVar61) {
        (*this->_vptr_ExpressionRunner[2])(this,"null ref");
      }
      auStack_98._0_4_ = Literal::geti31(pLVar30,SUB81(curr[1].type.id,0));
      start.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 2;
      Flow::Flow(__return_storage_ptr__,(Literal *)auStack_98);
      goto LAB_0013f019;
    }
    Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    break;
  case CallRefId:
    end.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    end.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    end.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
    end.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.
    str._M_str = (char *)0x0;
    auStack_e8 = (undefined1  [8])0x0;
    end.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    end.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    generateArguments((Flow *)auStack_378,this,(ExpressionList *)(curr + 1),(Literals *)auStack_e8);
    if (ref.breakTo.super_IString.str._M_len == 0) {
      visit((Flow *)auStack_98,this,*(Expression **)(curr + 3));
      if (start.breakTo.super_IString.str._M_len == 0) {
        pLVar30 = Flow::getSingleValue((Flow *)auStack_98);
        wasm::Literal::Literal((Literal *)auStack_158,pLVar30);
        bVar61 = Type::isNull((Type *)&refData.
                                       super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_refcount);
        if (bVar61) {
          (*this->_vptr_ExpressionRunner[2])(this,"null target in call_ref");
        }
        if ((char)curr[3].type.id == '\x01') {
          SmallVector<wasm::Literal,_1UL>::push_back
                    ((SmallVector<wasm::Literal,_1UL> *)auStack_e8,(Literal *)auStack_158);
          pcVar54 = _replaceLaneI64x2;
          sVar28 = RETURN_CALL_FLOW;
          SmallVector<wasm::Literal,_1UL>::SmallVector
                    ((SmallVector<wasm::Literal,_1UL> *)__return_storage_ptr__,
                     (SmallVector<wasm::Literal,_1UL> *)auStack_e8);
          (__return_storage_ptr__->breakTo).super_IString.str._M_len = sVar28;
          (__return_storage_ptr__->breakTo).super_IString.str._M_str = pcVar54;
        }
        else {
          NVar68 = Literal::getFunc((Literal *)auStack_158);
          SmallVector<wasm::Literal,_1UL>::SmallVector
                    ((SmallVector<wasm::Literal,_1UL> *)auStack_1a8,
                     (SmallVector<wasm::Literal,_1UL> *)auStack_e8);
          ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::callFunction
                    ((Literals *)auStack_138,
                     (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)this,NVar68,
                     (Literals *)auStack_1a8);
          Flow::Flow(__return_storage_ptr__,(Literals *)auStack_138);
          SmallVector<wasm::Literal,_1UL>::~SmallVector
                    ((SmallVector<wasm::Literal,_1UL> *)auStack_138);
          SmallVector<wasm::Literal,_1UL>::~SmallVector
                    ((SmallVector<wasm::Literal,_1UL> *)auStack_1a8);
        }
        pLVar30 = (Literal *)auStack_158;
LAB_0013dc01:
        wasm::Literal::~Literal(pLVar30);
      }
      else {
        Flow::Flow(__return_storage_ptr__,(Flow *)auStack_98);
      }
      goto LAB_0013dc06;
    }
    Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
LAB_0013dc12:
    SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)auStack_378);
    pSVar25 = (SmallVector<wasm::Literal,_1UL> *)auStack_e8;
    goto LAB_00140a96;
  case RefTestId:
    visit((Flow *)auStack_98,this,*(Expression **)(curr + 1));
    if (start.breakTo.super_IString.str._M_len == 0) {
      pLVar30 = Flow::getSingleValue((Flow *)auStack_98);
      wasm::Literal::Literal((Literal *)auStack_e8,pLVar30);
      cVar16 = wasm::Type::isSubType
                         ((Type)end.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
                                field_0.i64,(Type)curr[1].type.id);
      if (cVar16 == '\0') {
        wasm::Literal::Literal((Literal *)auStack_1a8,(Literal *)auStack_e8);
        wasm::Literal::Literal((Literal *)auStack_138,(Literal *)auStack_1a8);
        Cast::
        Cast<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                  ((Cast *)auStack_378,(Failure *)auStack_138);
      }
      else {
        wasm::Literal::Literal((Literal *)auStack_1a8,(Literal *)auStack_e8);
        wasm::Literal::Literal((Literal *)auStack_138,(Literal *)auStack_1a8);
        Cast::
        Cast<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success>
                  ((Cast *)auStack_378,(Success *)auStack_138);
      }
      wasm::Literal::~Literal((Literal *)auStack_138);
      wasm::Literal::~Literal((Literal *)auStack_1a8);
      wasm::Literal::~Literal((Literal *)auStack_e8);
    }
    else {
      Flow::Flow((Flow *)auStack_138,(Flow *)auStack_98);
      Flow::Flow((Flow *)auStack_e8,(Flow *)auStack_138);
      Cast::
      Cast<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking>
                ((Cast *)auStack_378,(Breaking *)auStack_e8);
      SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)auStack_e8);
      SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)auStack_138);
    }
    SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)auStack_98);
    auVar52 = auStack_98;
    if ((char)ref.breakTo.super_IString.str._M_str == '\0') {
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    }
    else {
      auStack_98._1_3_ = 0;
      auStack_98[0] = (char)ref.breakTo.super_IString.str._M_str == '\x01';
      auStack_98._4_4_ = auVar52._4_4_;
      start.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 2;
      Flow::Flow(__return_storage_ptr__,(Literal *)auStack_98);
LAB_0013be6c:
      pLVar30 = (Literal *)auStack_98;
LAB_0013d8fd:
      wasm::Literal::~Literal(pLVar30);
    }
    goto LAB_0013d902;
  case RefCastId:
    visit((Flow *)auStack_98,this,*(Expression **)(curr + 1));
    if (start.breakTo.super_IString.str._M_len == 0) {
      pLVar30 = Flow::getSingleValue((Flow *)auStack_98);
      wasm::Literal::Literal((Literal *)auStack_e8,pLVar30);
      cVar16 = wasm::Type::isSubType
                         ((Type)end.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
                                field_0.i64,(Type)(curr->type).id);
      if (cVar16 == '\0') {
        wasm::Literal::Literal((Literal *)auStack_1a8,(Literal *)auStack_e8);
        wasm::Literal::Literal((Literal *)auStack_138,(Literal *)auStack_1a8);
        Cast::
        Cast<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                  ((Cast *)auStack_378,(Failure *)auStack_138);
      }
      else {
        wasm::Literal::Literal((Literal *)auStack_1a8,(Literal *)auStack_e8);
        wasm::Literal::Literal((Literal *)auStack_138,(Literal *)auStack_1a8);
        Cast::
        Cast<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success>
                  ((Cast *)auStack_378,(Success *)auStack_138);
      }
      wasm::Literal::~Literal((Literal *)auStack_138);
      wasm::Literal::~Literal((Literal *)auStack_1a8);
      wasm::Literal::~Literal((Literal *)auStack_e8);
    }
    else {
      Flow::Flow((Flow *)auStack_138,(Flow *)auStack_98);
      Flow::Flow((Flow *)auStack_e8,(Flow *)auStack_138);
      Cast::
      Cast<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking>
                ((Cast *)auStack_378,(Breaking *)auStack_e8);
      SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)auStack_e8);
      SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)auStack_138);
    }
    SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)auStack_98);
    if ((char)ref.breakTo.super_IString.str._M_str != '\0') {
      if ((char)ref.breakTo.super_IString.str._M_str != '\x01') {
        if ((char)ref.breakTo.super_IString.str._M_str != '\x02') {
          __assert_fail("cast.getFailure()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                        ,0x685,
                        "Flow wasm::ExpressionRunner<(anonymous namespace)::EvallingModuleRunner>::visitRefCast(RefCast *) [SubType = (anonymous namespace)::EvallingModuleRunner]"
                       );
        }
        (*this->_vptr_ExpressionRunner[2])(this,"cast error");
        wasm::handle_unreachable
                  ("unreachable",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                   ,0x687);
      }
      wasm::Literal::Literal((Literal *)auStack_98,(Literal *)auStack_378);
      Flow::Flow(__return_storage_ptr__,(Literal *)auStack_98);
      goto LAB_0013be6c;
    }
    Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
LAB_0013d902:
    Cast::~Cast((Cast *)auStack_378);
    goto LAB_00140a9b;
  case BrOnId:
    if (((undefined1  [16])curr[1] & (undefined1  [16])0xfffffffe) == (undefined1  [16])0x2) {
      visit((Flow *)auStack_98,this,(Expression *)curr[2].type.id);
      if (start.breakTo.super_IString.str._M_len == 0) {
        pLVar30 = Flow::getSingleValue((Flow *)auStack_98);
        wasm::Literal::Literal((Literal *)auStack_e8,pLVar30);
        cVar16 = wasm::Type::isSubType
                           ((Type)end.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0]
                                  .field_0.i64,(Type)*(uintptr_t *)(curr + 3));
        if (cVar16 == '\0') {
          wasm::Literal::Literal((Literal *)auStack_1a8,(Literal *)auStack_e8);
          wasm::Literal::Literal((Literal *)auStack_138,(Literal *)auStack_1a8);
          Cast::
          Cast<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                    ((Cast *)auStack_378,(Failure *)auStack_138);
        }
        else {
          wasm::Literal::Literal((Literal *)auStack_1a8,(Literal *)auStack_e8);
          wasm::Literal::Literal((Literal *)auStack_138,(Literal *)auStack_1a8);
          Cast::
          Cast<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success>
                    ((Cast *)auStack_378,(Success *)auStack_138);
        }
        wasm::Literal::~Literal((Literal *)auStack_138);
        wasm::Literal::~Literal((Literal *)auStack_1a8);
        wasm::Literal::~Literal((Literal *)auStack_e8);
      }
      else {
        Flow::Flow((Flow *)auStack_138,(Flow *)auStack_98);
        Flow::Flow((Flow *)auStack_e8,(Flow *)auStack_138);
        Cast::
        Cast<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking>
                  ((Cast *)auStack_378,(Breaking *)auStack_e8);
        SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)auStack_e8)
        ;
        SmallVector<wasm::Literal,_1UL>::~SmallVector
                  ((SmallVector<wasm::Literal,_1UL> *)auStack_138);
      }
      SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)auStack_98);
      if ((char)ref.breakTo.super_IString.str._M_str == '\x02') {
        if (*(int *)(curr + 1) == 2) {
          pLVar30 = (Literal *)auStack_158;
          wasm::Literal::Literal(pLVar30,(Literal *)auStack_378);
          Flow::Flow(__return_storage_ptr__,pLVar30);
        }
        else {
          NVar68.super_IString.str = *(IString *)&curr[1].type;
          pLVar30 = (Literal *)auStack_1c8;
          wasm::Literal::Literal(pLVar30,(Literal *)auStack_378);
          Flow::Flow(__return_storage_ptr__,NVar68,pLVar30);
        }
      }
      else {
        if ((char)ref.breakTo.super_IString.str._M_str != '\x01') {
          if ((char)ref.breakTo.super_IString.str._M_str != '\0') {
            __assert_fail("result",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                          ,0x698,
                          "Flow wasm::ExpressionRunner<(anonymous namespace)::EvallingModuleRunner>::visitBrOn(BrOn *) [SubType = (anonymous namespace)::EvallingModuleRunner]"
                         );
          }
          Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
          goto LAB_0013d902;
        }
        if (*(int *)(curr + 1) == 2) {
          NVar68.super_IString.str = *(IString *)&curr[1].type;
          pLVar30 = (Literal *)local_1f0;
          wasm::Literal::Literal(pLVar30,(Literal *)auStack_378);
          Flow::Flow(__return_storage_ptr__,NVar68,pLVar30);
        }
        else {
          pLVar30 = (Literal *)auStack_3a8;
          wasm::Literal::Literal(pLVar30,(Literal *)auStack_378);
          Flow::Flow(__return_storage_ptr__,pLVar30);
        }
      }
      goto LAB_0013d8fd;
    }
    visit((Flow *)auStack_378,this,(Expression *)curr[2].type.id);
    if (ref.breakTo.super_IString.str._M_len != 0) {
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
      break;
    }
    pLVar30 = Flow::getSingleValue((Flow *)auStack_378);
    if (*(int *)(curr + 1) == 0) {
      bVar61 = Type::isNull(&pLVar30->type);
      if (bVar61) {
        uVar5 = curr[1].type.id;
        pcVar54 = *(char **)(curr + 2);
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
        field_0.func.super_IString.str._M_str = (char *)0x0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
        type.id = 0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
        field_0.i64 = 0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (__return_storage_ptr__->breakTo).super_IString.str._M_len = uVar5;
        (__return_storage_ptr__->breakTo).super_IString.str._M_str = pcVar54;
        break;
      }
      wasm::Literal::Literal(&local_3d0,pLVar30);
      Flow::Flow(__return_storage_ptr__,&local_3d0);
      pLVar30 = &local_3d0;
    }
    else {
      bVar61 = Type::isNull(&pLVar30->type);
      if (bVar61) goto LAB_0013cac7;
      NVar68.super_IString.str = *(IString *)&curr[1].type;
      wasm::Literal::Literal(&local_408,pLVar30);
      Flow::Flow(__return_storage_ptr__,NVar68,&local_408);
      pLVar30 = &local_408;
    }
    goto LAB_00140a8a;
  case StructNewId:
    if ((curr->type).id == 1) {
      ref.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
      uVar5 = curr[1].type.id;
      auStack_378 = (undefined1  [8])(curr + 1);
      while( true ) {
        if ((ref.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed == uVar5) &&
           (auStack_378 == (undefined1  [8])(curr + 1))) {
          wasm::handle_unreachable
                    ("unreachable but no unreachable child",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                     ,0x6c2);
        }
        ppEVar20 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator*((Iterator *)auStack_378);
        visit(__return_storage_ptr__,this,*ppEVar20);
        if ((__return_storage_ptr__->breakTo).super_IString.str._M_str != (char *)0x0) break;
        SmallVector<wasm::Literal,_1UL>::~SmallVector
                  ((SmallVector<wasm::Literal,_1UL> *)__return_storage_ptr__);
        ref.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed =
             ref.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed + 1;
      }
      goto LAB_00140a9b;
    }
    auStack_1a8 = (undefined1  [8])Type::getHeapType(&curr->type);
    start.breakTo.super_IString.str._M_str = (char *)wasm::HeapType::getStruct();
    SmallVector<wasm::Literal,_1UL>::SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)auStack_378,
               *(long *)((long)start.breakTo.super_IString.str._M_str + 8) -
               *(long *)start.breakTo.super_IString.str._M_str >> 4);
    end.breakTo.super_IString.str._M_str = (char *)(curr + 1);
    uVar50 = 0;
    while( true ) {
      uVar59 = (ulong)uVar50;
      lVar56 = *(long *)start.breakTo.super_IString.str._M_str;
      if ((ulong)(*(long *)(start.breakTo.super_IString.str._M_str + 8) - lVar56 >> 4) <= uVar59)
      break;
      if (curr[1].type.id == 0) {
        wasm::Literal::makeZero((Type)auStack_98);
        pFVar53 = (Flow *)((ref.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.
                            id - 0x18) + uVar59 * 0x18);
        if (uVar59 == 0) {
          pFVar53 = &ref;
        }
        type = (uint *)ref.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type;
        wasm::Literal::operator=((Literal *)pFVar53,(Literal *)auStack_98);
        wasm::Literal::~Literal((Literal *)auStack_98);
      }
      else {
        ppEVar20 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                             ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               *)end.breakTo.super_IString.str._M_str,uVar59);
        visit(__return_storage_ptr__,this,*ppEVar20);
        if ((__return_storage_ptr__->breakTo).super_IString.str._M_str != (char *)0x0)
        goto LAB_00140a8f;
        pLVar30 = Flow::getSingleValue(__return_storage_ptr__);
        wasm::Literal::Literal((Literal *)auStack_e8,pLVar30);
        truncateForPacking((Literal *)auStack_98,
                           (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)
                           auStack_e8,(Literal *)(lVar56 + uVar59 * 0x10),(Field *)type);
        pFVar53 = (Flow *)((ref.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.
                            id - 0x18) + uVar59 * 0x18);
        if (uVar59 == 0) {
          pFVar53 = &ref;
        }
        type = (uint *)ref.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type;
        wasm::Literal::operator=((Literal *)pFVar53,(Literal *)auStack_98);
        wasm::Literal::~Literal((Literal *)auStack_98);
        wasm::Literal::~Literal((Literal *)auStack_e8);
        SmallVector<wasm::Literal,_1UL>::~SmallVector
                  ((SmallVector<wasm::Literal,_1UL> *)__return_storage_ptr__);
      }
      uVar50 = uVar50 + 1;
    }
    makeGCData((Literal *)auStack_138,
               (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)auStack_378,
               (Literals *)(curr->type).id,(Type)type);
    Flow::Flow(__return_storage_ptr__,(Literal *)auStack_138);
    goto LAB_0013d89a;
  case StructGetId:
    visit((Flow *)auStack_378,this,(Expression *)curr[1].type.id);
    if (ref.breakTo.super_IString.str._M_len == 0) {
      Flow::getSingleValue((Flow *)auStack_378);
      wasm::Literal::getGCData();
      if (auStack_138 == (undefined1  [8])0x0) {
        (*this->_vptr_ExpressionRunner[2])(this,"null ref");
      }
      auStack_98 = (undefined1  [8])Type::getHeapType((Type *)(curr[1].type.id + 8));
      plVar29 = (long *)wasm::HeapType::getStruct();
      uVar59 = (ulong)*(uint *)(curr + 1);
      cVar16 = (char)*(uint *)(curr + 1) * '\x18';
      puVar2 = (uintptr_t *)(*plVar29 + uVar59 * 0x10);
      auStack_1a8 = (undefined1  [8])*puVar2;
      length.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed = puVar2[1];
      pLVar30 = (((Literals *)((long)auStack_138 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                super__Vector_impl_data._M_start + (uVar59 - 1);
      if (uVar59 == 0) {
        pLVar30 = (((Literals *)((long)auStack_138 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                  fixed._M_elems;
      }
      wasm::Literal::Literal((Literal *)auStack_e8,pLVar30);
      extendForPacking((Literal *)auStack_98,
                       (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)auStack_e8,
                       (Literal *)auStack_1a8,(Field *)(ulong)curr[2]._id,(bool)cVar16);
      Flow::Flow(__return_storage_ptr__,(Literal *)auStack_98);
      wasm::Literal::~Literal((Literal *)auStack_98);
      wasm::Literal::~Literal((Literal *)auStack_e8);
      pFVar53 = (Flow *)&contents;
LAB_0013b291:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)pFVar53);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    }
    break;
  case StructSetId:
    visit((Flow *)auStack_378,this,(Expression *)curr[1].type.id);
    if (ref.breakTo.super_IString.str._M_len != 0) {
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
      break;
    }
    visit((Flow *)auStack_98,this,*(Expression **)(curr + 2));
    if (start.breakTo.super_IString.str._M_len != 0) {
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_98);
      goto LAB_00140861;
    }
    Flow::getSingleValue((Flow *)auStack_378);
    wasm::Literal::getGCData();
    if (auStack_1a8 == (undefined1  [8])0x0) {
      (*this->_vptr_ExpressionRunner[2])(this,"null ref");
    }
    auStack_e8 = (undefined1  [8])Type::getHeapType((Type *)(curr[1].type.id + 8));
    plVar29 = (long *)wasm::HeapType::getStruct();
    field = (Field *)((ulong)*(uint *)(curr + 1) * 0x10);
    auStack_158 = *(undefined1 (*) [8])(field + *plVar29);
    refData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)(field + *plVar29 + 8);
    pLVar30 = Flow::getSingleValue((Flow *)auStack_98);
    wasm::Literal::Literal((Literal *)auStack_138,pLVar30);
    truncateForPacking((Literal *)auStack_e8,
                       (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)auStack_138,
                       (Literal *)auStack_158,field);
    pLVar30 = (((Literals *)((long)auStack_1a8 + 8))->super_SmallVector<wasm::Literal,_1UL>).
              flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_start + ((ulong)*(uint *)(curr + 1) - 1);
    if ((ulong)*(uint *)(curr + 1) == 0) {
      pLVar30 = (((Literals *)((long)auStack_1a8 + 8))->super_SmallVector<wasm::Literal,_1UL>).fixed
                ._M_elems;
    }
    wasm::Literal::operator=(pLVar30,(Literal *)auStack_e8);
    wasm::Literal::~Literal((Literal *)auStack_e8);
    wasm::Literal::~Literal((Literal *)auStack_138);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0
    .func.super_IString.str._M_str = (char *)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id
         = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0
    .i64 = 0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
LAB_0013c983:
    pFVar53 = &length;
    goto LAB_0013fa98;
  case StructRMWId:
    visit((Flow *)auStack_378,this,(Expression *)curr[1].type.id);
    if (ref.breakTo.super_IString.str._M_len != 0) {
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
      break;
    }
    visit((Flow *)auStack_98,this,*(Expression **)(curr + 2));
    if (start.breakTo.super_IString.str._M_len != 0) {
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_98);
      goto LAB_00140861;
    }
    Flow::getSingleValue((Flow *)auStack_378);
    wasm::Literal::getGCData();
    if (auStack_158 == (undefined1  [8])0x0) {
      (*this->_vptr_ExpressionRunner[2])(this,"null ref");
    }
    pLVar30 = (((Literals *)((long)auStack_158 + 8))->super_SmallVector<wasm::Literal,_1UL>).
              flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_start + ((ulong)*(uint *)&curr[1].field_0x4 - 1);
    if ((ulong)*(uint *)&curr[1].field_0x4 == 0) {
      pLVar30 = (((Literals *)((long)auStack_158 + 8))->super_SmallVector<wasm::Literal,_1UL>).fixed
                ._M_elems;
    }
    wasm::Literal::Literal((Literal *)auStack_e8,pLVar30);
    pLVar47 = Flow::getSingleValue((Flow *)auStack_98);
    wasm::Literal::Literal((Literal *)auStack_138,pLVar47);
    switch(*(undefined4 *)(curr + 1)) {
    case 0:
      wasm::Literal::add((Literal *)auStack_1a8);
      wasm::Literal::operator=(pLVar30,(Literal *)auStack_1a8);
      break;
    case 1:
      wasm::Literal::sub((Literal *)auStack_1a8);
      wasm::Literal::operator=(pLVar30,(Literal *)auStack_1a8);
      break;
    case 2:
      wasm::Literal::and_((Literal *)auStack_1a8);
      wasm::Literal::operator=(pLVar30,(Literal *)auStack_1a8);
      break;
    case 3:
      wasm::Literal::or_((Literal *)auStack_1a8);
      wasm::Literal::operator=(pLVar30,(Literal *)auStack_1a8);
      break;
    case 4:
      wasm::Literal::xor_((Literal *)auStack_1a8);
      wasm::Literal::operator=(pLVar30,(Literal *)auStack_1a8);
      break;
    case 5:
      wasm::Literal::operator=(pLVar30,(Literal *)auStack_138);
    default:
      goto switchD_0013cc04_default;
    }
    wasm::Literal::~Literal((Literal *)auStack_1a8);
switchD_0013cc04_default:
    wasm::Literal::Literal((Literal *)auStack_1a8,(Literal *)auStack_e8);
    Flow::Flow(__return_storage_ptr__,(Literal *)auStack_1a8);
    wasm::Literal::~Literal((Literal *)auStack_1a8);
    wasm::Literal::~Literal((Literal *)auStack_138);
    wasm::Literal::~Literal((Literal *)auStack_e8);
    pFVar53 = (Flow *)&refData;
LAB_0013fa98:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)pFVar53);
    goto LAB_00140861;
  case StructCmpxchgId:
    visit((Flow *)auStack_378,this,(Expression *)curr[1].type.id);
    if (ref.breakTo.super_IString.str._M_len == 0) {
      visit((Flow *)auStack_98,this,*(Expression **)(curr + 2));
      if (start.breakTo.super_IString.str._M_len == 0) {
        visit((Flow *)auStack_e8,this,(Expression *)curr[2].type.id);
        if (end.breakTo.super_IString.str._M_len == 0) {
          Flow::getSingleValue((Flow *)auStack_378);
          wasm::Literal::getGCData();
          if (auStack_158 == (undefined1  [8])0x0) {
            (*this->_vptr_ExpressionRunner[2])(this,"null ref");
          }
          pLVar30 = (((Literals *)((long)auStack_158 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                    flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                    _M_impl.super__Vector_impl_data._M_start + ((ulong)*(uint *)(curr + 1) - 1);
          if ((ulong)*(uint *)(curr + 1) == 0) {
            pLVar30 = (((Literals *)((long)auStack_158 + 8))->super_SmallVector<wasm::Literal,_1UL>)
                      .fixed._M_elems;
          }
          wasm::Literal::Literal((Literal *)auStack_138,pLVar30);
          pLVar47 = Flow::getSingleValue((Flow *)auStack_98);
          cVar16 = wasm::Literal::operator==(pLVar30,pLVar47);
          if (cVar16 != '\0') {
            pLVar47 = Flow::getSingleValue((Flow *)auStack_e8);
            wasm::Literal::operator=(pLVar30,pLVar47);
          }
          wasm::Literal::Literal((Literal *)auStack_1a8,(Literal *)auStack_138);
          Flow::Flow(__return_storage_ptr__,(Literal *)auStack_1a8);
          wasm::Literal::~Literal((Literal *)auStack_1a8);
          wasm::Literal::~Literal((Literal *)auStack_138);
LAB_0013ed41:
          pFVar53 = (Flow *)&refData;
LAB_0013ed48:
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)pFVar53);
        }
        else {
          Flow::Flow(__return_storage_ptr__,(Flow *)auStack_e8);
        }
        goto LAB_00140855;
      }
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_98);
      goto LAB_00140861;
    }
    Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    break;
  case ArrayNewId:
    ref.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ref.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ref.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    ref.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ref.breakTo.super_IString.str._M_len = 0;
    ref.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
    ref.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.
    str._M_str = (char *)0x0;
    auStack_378 = (undefined1  [8])0x0;
    ref.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    if (*(Expression **)(curr + 1) != (Expression *)0x0) {
      visit((Flow *)auStack_98,this,*(Expression **)(curr + 1));
      Flow::operator=((Flow *)auStack_378,(Flow *)auStack_98);
      SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)auStack_98);
      if (ref.breakTo.super_IString.str._M_len != 0) {
        Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
        break;
      }
    }
    visit((Flow *)auStack_98,this,(Expression *)curr[1].type.id);
    if (start.breakTo.super_IString.str._M_len == 0) {
      if ((curr->type).id != 1) {
        pTVar1 = &curr->type;
        local_1f0 = (undefined1  [8])Type::getHeapType(pTVar1);
        wasm::HeapType::getArray();
        pLVar30 = Flow::getSingleValue((Flow *)auStack_98);
        uVar50 = Literal::geti32(pLVar30);
        if (0x2aaaaa9 < uVar50) {
          (*this->_vptr_ExpressionRunner[3])(this,"allocation failure");
        }
        uVar59 = (ulong)uVar50;
        SmallVector<wasm::Literal,_1UL>::SmallVector
                  ((SmallVector<wasm::Literal,_1UL> *)auStack_e8,uVar59);
        if (*(long *)(curr + 1) == 0) {
          wasm::Literal::makeZero((Type)auStack_138);
          for (lVar56 = 0; uVar59 * 0x18 - lVar56 != 0; lVar56 = lVar56 + 0x18) {
            pFVar53 = (Flow *)((end.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
                                type.id - 0x18) + lVar56);
            if (lVar56 == 0) {
              pFVar53 = &end;
            }
            wasm::Literal::operator=((Literal *)pFVar53,(Literal *)auStack_138);
          }
        }
        else {
          auStack_1a8 = (undefined1  [8])Type::getHeapType(pTVar1);
          wasm::HeapType::getArray();
          auStack_1c8 = auStack_138;
          destData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)contents.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
          pLVar30 = Flow::getSingleValue((Flow *)auStack_378);
          wasm::Literal::Literal((Literal *)auStack_1a8,pLVar30);
          truncateForPacking((Literal *)auStack_138,
                             (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)
                             auStack_1a8,(Literal *)auStack_1c8,(Field *)type);
          wasm::Literal::~Literal((Literal *)auStack_1a8);
          for (lVar56 = 0; uVar59 * 0x18 - lVar56 != 0; lVar56 = lVar56 + 0x18) {
            pFVar53 = (Flow *)((end.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
                                type.id - 0x18) + lVar56);
            if (lVar56 == 0) {
              pFVar53 = &end;
            }
            wasm::Literal::operator=((Literal *)pFVar53,(Literal *)auStack_138);
          }
        }
        wasm::Literal::~Literal((Literal *)auStack_138);
        makeGCData((Literal *)auStack_138,
                   (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)auStack_e8,
                   (Literals *)pTVar1->id,(Type)type);
        Flow::Flow(__return_storage_ptr__,(Literal *)auStack_138);
        goto LAB_00140849;
      }
      visit(__return_storage_ptr__,this,*(Expression **)(curr + 1));
      if ((__return_storage_ptr__->breakTo).super_IString.str._M_str == (char *)0x0) {
        __assert_fail("init.breaking()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                      ,0x74f,
                      "Flow wasm::ExpressionRunner<(anonymous namespace)::EvallingModuleRunner>::visitArrayNew(ArrayNew *) [SubType = (anonymous namespace)::EvallingModuleRunner]"
                     );
      }
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_98);
    }
    goto LAB_00140861;
  case ArrayNewDataId:
    visit((Flow *)auStack_378,this,*(Expression **)(curr + 2));
    if (ref.breakTo.super_IString.str._M_len == 0) {
      visit((Flow *)auStack_98,this,(Expression *)curr[2].type.id);
      if (start.breakTo.super_IString.str._M_len != 0) {
        Flow::Flow(__return_storage_ptr__,(Flow *)auStack_98);
        goto LAB_00140861;
      }
      Flow::getSingleValue((Flow *)auStack_378);
      uVar59 = wasm::Literal::getUnsigned();
      Flow::getSingleValue((Flow *)auStack_98);
      sVar28 = wasm::Literal::getUnsigned();
      pTVar1 = &curr->type;
      auStack_158 = (undefined1  [8])Type::getHeapType(pTVar1);
      wasm::HeapType::getArray();
      end.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
      end.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      end.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
      end.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.
      str._M_str = (char *)0x0;
      end.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      auStack_e8 = (undefined1  [8])0x0;
      end.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
      NVar74.super_IString.str._M_str = *(char **)(curr + 1);
      NVar74.super_IString.str._M_len = (size_t)this[1]._vptr_ExpressionRunner;
      start.breakTo.super_IString.str._M_str = (char *)wasm::Module::getDataSegment(NVar74);
      uVar50 = wasm::Field::getByteSize();
      uVar32 = uVar50 * sVar28 + uVar59;
      end.breakTo.super_IString.str._M_str = (char *)pTVar1;
      if ((CARRY8(uVar50 * sVar28,uVar59)) ||
         (type = (uint *)start.breakTo.super_IString.str._M_str,
         (ulong)(*(long *)(start.breakTo.super_IString.str._M_str + 0x40) -
                *(long *)(start.breakTo.super_IString.str._M_str + 0x38)) < uVar32)) {
        (*this->_vptr_ExpressionRunner[2])(this,"out of bounds segment access in array.new_data");
      }
      sVar46 = std::
               _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        *)&this[4].maxDepth,(key_type *)(curr + 1));
      if ((uVar32 != 0) && (sVar46 != 0)) {
        (*this->_vptr_ExpressionRunner[2])(this,"dropped segment access in array.new_data");
      }
      SmallVector<wasm::Literal,_1UL>::reserve((SmallVector<wasm::Literal,_1UL> *)auStack_e8,sVar28)
      ;
      for (; (uVar59 & 0xffffffff) < uVar32; uVar59 = (ulong)((int)uVar59 + uVar50)) {
        type = (uint *)length.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
        makeFromMemory((Literal *)auStack_138,
                       (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)
                       (*(long *)(start.breakTo.super_IString.str._M_str + 0x38) +
                       (uVar59 & 0xffffffff)),auStack_1a8);
        SmallVector<wasm::Literal,_1UL>::push_back
                  ((SmallVector<wasm::Literal,_1UL> *)auStack_e8,(Literal *)auStack_138);
        wasm::Literal::~Literal((Literal *)auStack_138);
      }
      makeGCData((Literal *)auStack_138,
                 (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)auStack_e8,
                 *(Literals **)end.breakTo.super_IString.str._M_str,(Type)type);
      Flow::Flow(__return_storage_ptr__,(Literal *)auStack_138);
      goto LAB_00140849;
    }
    Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    break;
  case ArrayNewElemId:
    visit((Flow *)auStack_378,this,*(Expression **)(curr + 2));
    if (ref.breakTo.super_IString.str._M_len == 0) {
      visit((Flow *)auStack_98,this,(Expression *)curr[2].type.id);
      if (start.breakTo.super_IString.str._M_len != 0) {
        Flow::Flow(__return_storage_ptr__,(Flow *)auStack_98);
        goto LAB_00140861;
      }
      Flow::getSingleValue((Flow *)auStack_378);
      uVar32 = wasm::Literal::getUnsigned();
      Flow::getSingleValue((Flow *)auStack_98);
      sVar28 = wasm::Literal::getUnsigned();
      contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
      contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
      contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.
      str._M_str = (char *)0x0;
      contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      auStack_138 = (undefined1  [8])0x0;
      contents.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
      NVar76.super_IString.str._M_str = *(char **)(curr + 1);
      NVar76.super_IString.str._M_len = (size_t)this[1]._vptr_ExpressionRunner;
      lVar56 = wasm::Module::getElementSegment(NVar76);
      uVar59 = sVar28 + uVar32;
      if ((ulong)(*(long *)(lVar56 + 0x40) - *(long *)(lVar56 + 0x38) >> 3) < uVar59) {
        (*this->_vptr_ExpressionRunner[2])(this,"out of bounds segment access in array.new_elem");
LAB_0013da47:
        sVar46 = std::
                 _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)&this[6].module,(key_type *)(curr + 1));
        if (sVar46 != 0) {
          (*this->_vptr_ExpressionRunner[2])(this,"out of bounds segment access in array.new_elem");
        }
      }
      else if (uVar59 != 0) goto LAB_0013da47;
      SmallVector<wasm::Literal,_1UL>::reserve
                ((SmallVector<wasm::Literal,_1UL> *)auStack_138,sVar28);
      for (; (uVar32 & 0xffffffff) < uVar59; uVar32 = (ulong)((int)uVar32 + 1)) {
        visit((Flow *)auStack_e8,this,
              *(Expression **)(*(long *)(lVar56 + 0x38) + (uVar32 & 0xffffffff) * 8));
        pLVar30 = Flow::getSingleValue((Flow *)auStack_e8);
        wasm::Literal::Literal((Literal *)auStack_1a8,pLVar30);
        SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)auStack_e8)
        ;
        SmallVector<wasm::Literal,_1UL>::push_back
                  ((SmallVector<wasm::Literal,_1UL> *)auStack_138,(Literal *)auStack_1a8);
        wasm::Literal::~Literal((Literal *)auStack_1a8);
      }
      makeGCData((Literal *)auStack_e8,
                 (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)auStack_138,
                 (Literals *)(curr->type).id,(Type)type);
      Flow::Flow(__return_storage_ptr__,(Literal *)auStack_e8);
      wasm::Literal::~Literal((Literal *)auStack_e8);
      pSVar25 = (SmallVector<wasm::Literal,_1UL> *)auStack_138;
      goto LAB_0014085c;
    }
    Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    break;
  case ArrayNewFixedId:
    uVar59 = curr[1].type.id;
    if (0x2aaaaa9 < (uint)uVar59) {
      (*this->_vptr_ExpressionRunner[3])(this,"allocation failure");
    }
    pMVar35 = (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)(curr + 1);
    if ((curr->type).id == 1) {
      ref.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
      uVar5 = curr[1].type.id;
      auStack_378 = (undefined1  [8])pMVar35;
      while( true ) {
        if ((ref.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed == uVar5) &&
           (auStack_378 == (undefined1  [8])pMVar35)) {
          wasm::handle_unreachable
                    ("unreachable but no unreachable child",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                     ,0x778);
        }
        ppEVar20 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator*((Iterator *)auStack_378);
        visit(__return_storage_ptr__,this,*ppEVar20);
        if ((__return_storage_ptr__->breakTo).super_IString.str._M_str != (char *)0x0) break;
        SmallVector<wasm::Literal,_1UL>::~SmallVector
                  ((SmallVector<wasm::Literal,_1UL> *)__return_storage_ptr__);
        ref.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed =
             ref.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed + 1;
      }
      goto LAB_00140a9b;
    }
    pcVar54 = (char *)(uVar59 & 0xffffffff);
    end.breakTo.super_IString.str._M_str = (char *)&curr->type;
    auStack_158 = (undefined1  [8])Type::getHeapType((Type *)end.breakTo.super_IString.str._M_str);
    wasm::HeapType::getArray();
    start.breakTo.super_IString.str._M_str = pcVar54;
    SmallVector<wasm::Literal,_1UL>::SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)auStack_378,(size_t)pcVar54);
    lVar56 = -0x18;
    for (pcVar54 = (char *)0x0; start.breakTo.super_IString.str._M_str != pcVar54;
        pcVar54 = pcVar54 + 1) {
      ppEVar20 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            pMVar35,(size_t)pcVar54);
      visit(__return_storage_ptr__,this,*ppEVar20);
      if ((__return_storage_ptr__->breakTo).super_IString.str._M_str != (char *)0x0)
      goto LAB_00140a8f;
      pLVar30 = Flow::getSingleValue(__return_storage_ptr__);
      wasm::Literal::Literal((Literal *)auStack_e8,pLVar30);
      truncateForPacking((Literal *)auStack_98,
                         (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)auStack_e8
                         ,(Literal *)auStack_1a8,(Field *)type);
      pFVar53 = (Flow *)(ref.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id
                        + lVar56);
      if (pcVar54 == (char *)0x0) {
        pFVar53 = &ref;
      }
      wasm::Literal::operator=((Literal *)pFVar53,(Literal *)auStack_98);
      wasm::Literal::~Literal((Literal *)auStack_98);
      wasm::Literal::~Literal((Literal *)auStack_e8);
      SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)__return_storage_ptr__);
      lVar56 = lVar56 + 0x18;
    }
    makeGCData((Literal *)auStack_138,
               (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)auStack_378,
               *(Literals **)end.breakTo.super_IString.str._M_str,(Type)type);
    Flow::Flow(__return_storage_ptr__,(Literal *)auStack_138);
LAB_0013d89a:
    pLVar30 = (Literal *)auStack_138;
LAB_00140a8a:
    wasm::Literal::~Literal(pLVar30);
    break;
  case ArrayGetId:
    visit((Flow *)auStack_378,this,*(Expression **)(curr + 1));
    if (ref.breakTo.super_IString.str._M_len == 0) {
      visit((Flow *)auStack_98,this,(Expression *)curr[1].type.id);
      if (start.breakTo.super_IString.str._M_len == 0) {
        Flow::getSingleValue((Flow *)auStack_378);
        wasm::Literal::getGCData();
        if (auStack_1a8 == (undefined1  [8])0x0) {
          (*this->_vptr_ExpressionRunner[2])(this,"null ref");
        }
        pLVar30 = Flow::getSingleValue((Flow *)auStack_98);
        uVar50 = Literal::geti32(pLVar30);
        lVar56 = (long)(((Literals *)((long)auStack_1a8 + 8))->super_SmallVector<wasm::Literal,_1UL>
                       ).flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(((Literals *)((long)auStack_1a8 + 8))->super_SmallVector<wasm::Literal,_1UL>
                       ).flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)&(((Module *)
                            (((Literals *)((long)auStack_1a8 + 8))->
                            super_SmallVector<wasm::Literal,_1UL>).usedFixed)->exports).
                           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar56 / 0x18) <=
            (ulong)uVar50) {
          (*this->_vptr_ExpressionRunner[2])(this,"array oob",lVar56 % 0x18);
        }
        auStack_138 = (undefined1  [8])Type::getHeapType((Type *)(*(long *)(curr + 1) + 8));
        wasm::HeapType::getArray();
        auStack_158 = auStack_e8;
        refData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)end.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
        pLVar30 = (((Literals *)((long)auStack_1a8 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                  flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl
                  .super__Vector_impl_data._M_start + ((ulong)uVar50 - 1);
        if (uVar50 == 0) {
          pLVar30 = (((Literals *)((long)auStack_1a8 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                    fixed._M_elems;
        }
        wasm::Literal::Literal((Literal *)auStack_138,pLVar30);
        extendForPacking((Literal *)auStack_e8,
                         (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)
                         auStack_138,(Literal *)auStack_158,(Field *)(ulong)curr[2]._id,(bool)in_R8B
                        );
        Flow::Flow(__return_storage_ptr__,(Literal *)auStack_e8);
        wasm::Literal::~Literal((Literal *)auStack_e8);
        wasm::Literal::~Literal((Literal *)auStack_138);
        goto LAB_0013c983;
      }
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_98);
      goto LAB_00140861;
    }
    Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    break;
  case ArraySetId:
    visit((Flow *)auStack_378,this,*(Expression **)(curr + 1));
    if (ref.breakTo.super_IString.str._M_len == 0) {
      visit((Flow *)auStack_98,this,(Expression *)curr[1].type.id);
      if (start.breakTo.super_IString.str._M_len == 0) {
        visit((Flow *)auStack_e8,this,*(Expression **)(curr + 2));
        if (end.breakTo.super_IString.str._M_len == 0) {
          Flow::getSingleValue((Flow *)auStack_378);
          wasm::Literal::getGCData();
          if (auStack_158 == (undefined1  [8])0x0) {
            (*this->_vptr_ExpressionRunner[2])(this,"null ref");
          }
          pLVar30 = Flow::getSingleValue((Flow *)auStack_98);
          uVar50 = Literal::geti32(pLVar30);
          lVar56 = (long)(((Literals *)((long)auStack_158 + 8))->
                         super_SmallVector<wasm::Literal,_1UL>).flexible.
                         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(((Literals *)((long)auStack_158 + 8))->
                         super_SmallVector<wasm::Literal,_1UL>).flexible.
                         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                         super__Vector_impl_data._M_start;
          auVar52 = auStack_158;
          if (lVar56 / 0x18 +
              (((Literals *)((long)auStack_158 + 8))->super_SmallVector<wasm::Literal,_1UL>).
              usedFixed <= (ulong)uVar50) {
            (*this->_vptr_ExpressionRunner[2])(this,"array oob",lVar56 % 0x18);
          }
          auStack_1a8 = (undefined1  [8])Type::getHeapType((Type *)(*(long *)(curr + 1) + 8));
          wasm::HeapType::getArray();
          auStack_1c8 = auStack_138;
          destData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)contents.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
          pLVar30 = Flow::getSingleValue((Flow *)auStack_e8);
          wasm::Literal::Literal((Literal *)auStack_1a8,pLVar30);
          truncateForPacking((Literal *)auStack_138,
                             (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)
                             auStack_1a8,(Literal *)auStack_1c8,(Field *)auVar52);
          pLVar30 = (((Literals *)((long)auStack_158 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                    flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                    _M_impl.super__Vector_impl_data._M_start + ((ulong)uVar50 - 1);
          if (uVar50 == 0) {
            pLVar30 = (((Literals *)((long)auStack_158 + 8))->super_SmallVector<wasm::Literal,_1UL>)
                      .fixed._M_elems;
          }
          wasm::Literal::operator=(pLVar30,(Literal *)auStack_138);
          wasm::Literal::~Literal((Literal *)auStack_138);
          wasm::Literal::~Literal((Literal *)auStack_1a8);
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.func.super_IString.str._M_str = (char *)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          type.id = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.i64 = 0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
          goto LAB_0013ed41;
        }
        Flow::Flow(__return_storage_ptr__,(Flow *)auStack_e8);
        goto LAB_00140855;
      }
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_98);
      goto LAB_00140861;
    }
    Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    break;
  case ArrayLenId:
    visit((Flow *)auStack_378,this,*(Expression **)(curr + 1));
    if (ref.breakTo.super_IString.str._M_len == 0) {
      Flow::getSingleValue((Flow *)auStack_378);
      wasm::Literal::getGCData();
      if (auStack_e8 == (undefined1  [8])0x0) {
        (*this->_vptr_ExpressionRunner[2])(this,"null ref");
      }
      auStack_98._0_4_ =
           (int)(((long)(((Literals *)((long)auStack_e8 + 8))->super_SmallVector<wasm::Literal,_1UL>
                        ).flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(((Literals *)((long)auStack_e8 + 8))->super_SmallVector<wasm::Literal,_1UL>)
                       .flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                       _M_impl.super__Vector_impl_data._M_start) / 0x18) +
           (int)(((Literals *)((long)auStack_e8 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                usedFixed;
      start.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 2;
      Flow::Flow(__return_storage_ptr__,(Literal *)auStack_98);
      wasm::Literal::~Literal((Literal *)auStack_98);
      pFVar53 = &end;
      goto LAB_0013b291;
    }
    Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    break;
  case ArrayCopyId:
    visit((Flow *)auStack_378,this,*(Expression **)(curr + 1));
    if (ref.breakTo.super_IString.str._M_len == 0) {
      visit((Flow *)auStack_98,this,(Expression *)curr[1].type.id);
      if (start.breakTo.super_IString.str._M_len == 0) {
        visit((Flow *)auStack_e8,this,*(Expression **)(curr + 2));
        if (end.breakTo.super_IString.str._M_len == 0) {
          visit((Flow *)auStack_138,this,(Expression *)curr[2].type.id);
          if (local_f8 == (char *)0x0) {
            visit((Flow *)auStack_1a8,this,*(Expression **)(curr + 3));
            if (length.breakTo.super_IString.str._M_len == 0) {
              Flow::getSingleValue((Flow *)auStack_378);
              wasm::Literal::getGCData();
              if (auStack_1c8 == (undefined1  [8])0x0) {
                (*this->_vptr_ExpressionRunner[2])(this,"null ref");
              }
              Flow::getSingleValue((Flow *)auStack_e8);
              wasm::Literal::getGCData();
              if (local_1f0 == (undefined1  [8])0x0) {
                (*this->_vptr_ExpressionRunner[2])(this,"null ref");
              }
              Flow::getSingleValue((Flow *)auStack_98);
              start.breakTo.super_IString.str._M_str = (char *)wasm::Literal::getUnsigned();
              Flow::getSingleValue((Flow *)auStack_138);
              lVar56 = wasm::Literal::getUnsigned();
              Flow::getSingleValue((Flow *)auStack_1a8);
              __new_size = wasm::Literal::getUnsigned();
              lVar31 = (long)(((Literals *)((long)auStack_1c8 + 8))->
                             super_SmallVector<wasm::Literal,_1UL>).flexible.
                             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(((Literals *)((long)auStack_1c8 + 8))->
                             super_SmallVector<wasm::Literal,_1UL>).flexible.
                             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                             _M_impl.super__Vector_impl_data._M_start;
              if ((char *)((long)&(((Module *)
                                   (((Literals *)((long)auStack_1c8 + 8))->
                                   super_SmallVector<wasm::Literal,_1UL>).usedFixed)->exports).
                                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar31 / 0x18) <
                  start.breakTo.super_IString.str._M_str + __new_size) {
                (*this->_vptr_ExpressionRunner[2])(this,"oob",lVar31 % 0x18);
              }
              lVar31 = (long)(((Literals *)((long)local_1f0 + 8))->
                             super_SmallVector<wasm::Literal,_1UL>).flexible.
                             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(((Literals *)((long)local_1f0 + 8))->
                             super_SmallVector<wasm::Literal,_1UL>).flexible.
                             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                             _M_impl.super__Vector_impl_data._M_start;
              if (lVar31 / 0x18 +
                  (((Literals *)((long)local_1f0 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                  usedFixed < lVar56 + __new_size) {
                (*this->_vptr_ExpressionRunner[2])(this,"oob",lVar31 % 0x18);
              }
              auStack_158 = (undefined1  [8])0x0;
              refData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              refData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                   = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::resize
                        ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)auStack_158,
                         __new_size);
              lVar43 = 0;
              for (lVar31 = 0; pcVar54 = start.breakTo.super_IString.str._M_str,
                  -lVar31 != __new_size; lVar31 = lVar31 + -1) {
                pLVar30 = (Literal *)
                          ((long)&(((Literals *)((long)local_1f0 + 8))->
                                  super_SmallVector<wasm::Literal,_1UL>).flexible.
                                  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                                  _M_impl.super__Vector_impl_data._M_start[lVar56 + -1].field_0 +
                          lVar43);
                if (lVar56 == lVar31) {
                  pLVar30 = (((Literals *)((long)local_1f0 + 8))->
                            super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems;
                }
                wasm::Literal::operator=
                          ((Literal *)
                           ((long)(((Literals *)((long)auStack_158 + 8))->
                                  super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems +
                           lVar43 + -0x10),pLVar30);
                lVar43 = lVar43 + 0x18;
              }
              lVar56 = 0;
              for (pcVar60 = (char *)0x0; -(long)pcVar60 != __new_size; pcVar60 = pcVar60 + -1) {
                pLVar30 = (Literal *)
                          ((long)&(((Literals *)((long)auStack_1c8 + 8))->
                                  super_SmallVector<wasm::Literal,_1UL>).flexible.
                                  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                                  _M_impl.super__Vector_impl_data._M_start[(long)(pcVar54 + -1)].
                                  field_0 + lVar56);
                if (pcVar54 == pcVar60) {
                  pLVar30 = (((Literals *)((long)auStack_1c8 + 8))->
                            super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems;
                }
                wasm::Literal::operator=
                          (pLVar30,(Literal *)
                                   ((long)(((Literals *)((long)auStack_158 + 8))->
                                          super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems +
                                   lVar56 + -0x10));
                lVar56 = lVar56 + 0x18;
              }
              (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
              (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
              [0].field_0.func.super_IString.str._M_str = (char *)0x0;
              (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
              [0].type.id = 0;
              (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
              (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
              [0].field_0.i64 = 0;
              (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
              std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                        ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)auStack_158);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&srcData);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&destData);
            }
            else {
              Flow::Flow(__return_storage_ptr__,(Flow *)auStack_1a8);
            }
            SmallVector<wasm::Literal,_1UL>::~SmallVector
                      ((SmallVector<wasm::Literal,_1UL> *)auStack_1a8);
          }
          else {
            Flow::Flow(__return_storage_ptr__,(Flow *)auStack_138);
          }
          goto LAB_001406ba;
        }
        Flow::Flow(__return_storage_ptr__,(Flow *)auStack_e8);
        goto LAB_00140855;
      }
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_98);
      goto LAB_00140861;
    }
    Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    break;
  case ArrayFillId:
    visit((Flow *)auStack_378,this,*(Expression **)(curr + 1));
    if (ref.breakTo.super_IString.str._M_len == 0) {
      visit((Flow *)auStack_98,this,(Expression *)curr[1].type.id);
      if (start.breakTo.super_IString.str._M_len != 0) {
        Flow::Flow(__return_storage_ptr__,(Flow *)auStack_98);
        goto LAB_00140861;
      }
      visit((Flow *)auStack_e8,this,*(Expression **)(curr + 2));
      if (end.breakTo.super_IString.str._M_len != 0) {
        Flow::Flow(__return_storage_ptr__,(Flow *)auStack_e8);
        goto LAB_00140855;
      }
      visit((Flow *)auStack_138,this,(Expression *)curr[2].type.id);
      if (local_f8 != (char *)0x0) {
        Flow::Flow(__return_storage_ptr__,(Flow *)auStack_138);
        goto LAB_001406ba;
      }
      Flow::getSingleValue((Flow *)auStack_378);
      wasm::Literal::getGCData();
      if (local_1f0 == (undefined1  [8])0x0) {
        (*this->_vptr_ExpressionRunner[2])(this,"null ref");
      }
      Flow::getSingleValue((Flow *)auStack_98);
      uVar59 = wasm::Literal::getUnsigned();
      pLVar30 = Flow::getSingleValue((Flow *)auStack_e8);
      wasm::Literal::Literal((Literal *)auStack_1a8,pLVar30);
      Flow::getSingleValue((Flow *)auStack_138);
      uVar32 = wasm::Literal::getUnsigned();
      auStack_1c8 = (undefined1  [8])Type::getHeapType((Type *)(*(long *)(curr + 1) + 8));
      wasm::HeapType::getArray();
      auStack_3a8 = auStack_158;
      _field_4 = refData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      wasm::Literal::Literal((Literal *)auStack_1c8,(Literal *)auStack_1a8);
      truncateForPacking((Literal *)auStack_158,
                         (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)
                         auStack_1c8,(Literal *)auStack_3a8,(Field *)type);
      wasm::Literal::operator=((Literal *)auStack_1a8,(Literal *)auStack_158);
      wasm::Literal::~Literal((Literal *)auStack_158);
      wasm::Literal::~Literal((Literal *)auStack_1c8);
      uVar45 = ((long)(((Literals *)((long)local_1f0 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                      flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(((Literals *)((long)local_1f0 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                     flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x18 +
               (((Literals *)((long)local_1f0 + 8))->super_SmallVector<wasm::Literal,_1UL>).
               usedFixed;
      if (((uVar45 < uVar32 || uVar45 < uVar59) || (CARRY8(uVar32,uVar59))) ||
         (uVar45 < uVar32 + uVar59)) {
        (*this->_vptr_ExpressionRunner[2])(this,"out of bounds array access in array.fill");
      }
      lVar56 = uVar59 * 0x18 + -0x18;
      for (uVar45 = 0; -uVar45 != uVar32; uVar45 = uVar45 - 1) {
        pLVar30 = (((Literals *)((long)local_1f0 + 8))->super_SmallVector<wasm::Literal,_1UL>).fixed
                  ._M_elems;
        if (uVar59 != uVar45) {
          pLVar30 = (Literal *)
                    ((long)&((((Literals *)((long)local_1f0 + 8))->
                             super_SmallVector<wasm::Literal,_1UL>).flexible.
                             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                             _M_impl.super__Vector_impl_data._M_start)->field_0 + lVar56);
        }
        wasm::Literal::operator=(pLVar30,(Literal *)auStack_1a8);
        lVar56 = lVar56 + 0x18;
      }
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
      field_0.func.super_IString.str._M_str = (char *)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.
      id = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
      field_0.i64 = 0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
      wasm::Literal::~Literal((Literal *)auStack_1a8);
      this_03 = &srcData;
LAB_0014038f:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_03);
      goto LAB_001406ba;
    }
    Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    break;
  case ArrayInitDataId:
    visit((Flow *)auStack_378,this,*(Expression **)(curr + 2));
    if (ref.breakTo.super_IString.str._M_len == 0) {
      visit((Flow *)auStack_98,this,(Expression *)curr[2].type.id);
      if (start.breakTo.super_IString.str._M_len != 0) {
        Flow::Flow(__return_storage_ptr__,(Flow *)auStack_98);
        goto LAB_00140861;
      }
      visit((Flow *)auStack_e8,this,*(Expression **)(curr + 3));
      if (end.breakTo.super_IString.str._M_len != 0) {
        Flow::Flow(__return_storage_ptr__,(Flow *)auStack_e8);
        goto LAB_00140855;
      }
      visit((Flow *)auStack_138,this,(Expression *)curr[3].type.id);
      if (local_f8 != (char *)0x0) {
        Flow::Flow(__return_storage_ptr__,(Flow *)auStack_138);
        goto LAB_001406ba;
      }
      Flow::getSingleValue((Flow *)auStack_378);
      wasm::Literal::getGCData();
      if (auStack_158 == (undefined1  [8])0x0) {
        (*this->_vptr_ExpressionRunner[2])(this,"null ref");
      }
      Flow::getSingleValue((Flow *)auStack_98);
      start.breakTo.super_IString.str._M_str = (char *)wasm::Literal::getUnsigned();
      Flow::getSingleValue((Flow *)auStack_e8);
      lVar56 = wasm::Literal::getUnsigned();
      Flow::getSingleValue((Flow *)auStack_138);
      lVar31 = wasm::Literal::getUnsigned();
      lVar43 = (long)(((Literals *)((long)auStack_158 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                     flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(((Literals *)((long)auStack_158 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                     flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      if ((char *)(lVar43 / 0x18 +
                  (((Literals *)((long)auStack_158 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                  usedFixed) < start.breakTo.super_IString.str._M_str + lVar31) {
        (*this->_vptr_ExpressionRunner[2])
                  (this,"out of bounds array access in array.init",lVar43 % 0x18);
      }
      NVar79.super_IString.str._M_str = *(char **)(curr + 1);
      NVar79.super_IString.str._M_len = (size_t)this->module;
      end.breakTo.super_IString.str._M_str = (char *)wasm::Module::getDataSegment(NVar79);
      local_1f0 = (undefined1  [8])Type::getHeapType((Type *)(*(long *)(curr + 2) + 8));
      wasm::HeapType::getArray();
      auStack_1c8 = auStack_1a8;
      destData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)length.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
      uVar50 = wasm::Field::getByteSize();
      if ((ulong)(*(long *)(end.breakTo.super_IString.str._M_str + 0x40) -
                 *(long *)(end.breakTo.super_IString.str._M_str + 0x38)) <
          lVar31 * (ulong)uVar50 + lVar56) {
        (*this->_vptr_ExpressionRunner[2])(this,"out of bounds segment access in array.init_data");
      }
      if ((lVar56 + lVar31 != 0) &&
         (sVar46 = std::
                   _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                            *)&this[4].maxDepth,(key_type *)(curr + 1)), sVar46 != 0)) {
        (*this->_vptr_ExpressionRunner[2])(this,"out of bounds segment access in array.init_data");
      }
      lVar43 = (long)start.breakTo.super_IString.str._M_str * 0x18 + -0x18;
      for (pcVar54 = (char *)0x0; -(long)pcVar54 != lVar31; pcVar54 = pcVar54 + -1) {
        makeFromMemory((Literal *)auStack_1a8,
                       (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)
                       (*(long *)(end.breakTo.super_IString.str._M_str + 0x38) + lVar56),auStack_1c8
                       ,destData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      );
        pLVar30 = (((Literals *)((long)auStack_158 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                  fixed._M_elems;
        if (start.breakTo.super_IString.str._M_str != pcVar54) {
          pLVar30 = (Literal *)
                    ((long)&((((Literals *)((long)auStack_158 + 8))->
                             super_SmallVector<wasm::Literal,_1UL>).flexible.
                             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                             _M_impl.super__Vector_impl_data._M_start)->field_0 + lVar43);
        }
        wasm::Literal::operator=(pLVar30,(Literal *)auStack_1a8);
        wasm::Literal::~Literal((Literal *)auStack_1a8);
        lVar43 = lVar43 + 0x18;
        lVar56 = lVar56 + (ulong)uVar50;
      }
LAB_001402e1:
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
      field_0.func.super_IString.str._M_str = (char *)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.
      id = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
      field_0.i64 = 0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
      this_03 = &refData;
      goto LAB_0014038f;
    }
    Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    break;
  case ArrayInitElemId:
    visit((Flow *)auStack_378,this,*(Expression **)(curr + 2));
    if (ref.breakTo.super_IString.str._M_len == 0) {
      visit((Flow *)auStack_98,this,(Expression *)curr[2].type.id);
      if (start.breakTo.super_IString.str._M_len != 0) {
        Flow::Flow(__return_storage_ptr__,(Flow *)auStack_98);
        goto LAB_00140861;
      }
      visit((Flow *)auStack_e8,this,*(Expression **)(curr + 3));
      if (end.breakTo.super_IString.str._M_len != 0) {
        Flow::Flow(__return_storage_ptr__,(Flow *)auStack_e8);
        goto LAB_00140855;
      }
      visit((Flow *)auStack_138,this,(Expression *)curr[3].type.id);
      if (local_f8 != (char *)0x0) {
        Flow::Flow(__return_storage_ptr__,(Flow *)auStack_138);
        goto LAB_001406ba;
      }
      Flow::getSingleValue((Flow *)auStack_378);
      wasm::Literal::getGCData();
      if (auStack_158 == (undefined1  [8])0x0) {
        (*this->_vptr_ExpressionRunner[2])(this,"null ref");
      }
      Flow::getSingleValue((Flow *)auStack_98);
      lVar56 = wasm::Literal::getUnsigned();
      Flow::getSingleValue((Flow *)auStack_e8);
      lVar31 = wasm::Literal::getUnsigned();
      Flow::getSingleValue((Flow *)auStack_138);
      lVar43 = wasm::Literal::getUnsigned();
      lVar44 = (long)(((Literals *)((long)auStack_158 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                     flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(((Literals *)((long)auStack_158 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                     flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      if (lVar44 / 0x18 +
          (((Literals *)((long)auStack_158 + 8))->super_SmallVector<wasm::Literal,_1UL>).usedFixed <
          (ulong)(lVar43 + lVar56)) {
        (*this->_vptr_ExpressionRunner[2])
                  (this,"out of bounds array access in array.init",lVar44 % 0x18);
      }
      NVar68.super_IString.str._M_str = *(char **)(curr + 1);
      NVar68.super_IString.str._M_len = (size_t)this->module;
      start.breakTo.super_IString.str._M_str = (char *)wasm::Module::getElementSegment(NVar68);
      if ((ulong)(*(long *)(start.breakTo.super_IString.str._M_str + 0x40) -
                  *(long *)(start.breakTo.super_IString.str._M_str + 0x38) >> 3) <
          (ulong)(lVar31 + lVar43)) {
        (*this->_vptr_ExpressionRunner[2])(this,"out of bounds segment access in array.init_elem");
LAB_00140244:
        sVar46 = std::
                 _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)&this[6].module,(key_type *)(curr + 1));
        if (sVar46 != 0) {
          (*this->_vptr_ExpressionRunner[2])(this,"out of bounds segment access in array.init_elem")
          ;
        }
      }
      else if (lVar31 + lVar43 != 0) goto LAB_00140244;
      lVar44 = lVar56 * 0x18 + -0x18;
      for (lVar31 = 0; lVar43 != lVar31; lVar31 = lVar31 + 1) {
        visit((Flow *)auStack_1a8,this,
              *(Expression **)
               (*(long *)(start.breakTo.super_IString.str._M_str + 0x38) + lVar31 * 8));
        pLVar47 = Flow::getSingleValue((Flow *)auStack_1a8);
        pLVar30 = (((Literals *)((long)auStack_158 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                  fixed._M_elems;
        if (-lVar31 != lVar56) {
          pLVar30 = (Literal *)
                    ((long)&((((Literals *)((long)auStack_158 + 8))->
                             super_SmallVector<wasm::Literal,_1UL>).flexible.
                             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                             _M_impl.super__Vector_impl_data._M_start)->field_0 + lVar44);
        }
        wasm::Literal::operator=(pLVar30,pLVar47);
        SmallVector<wasm::Literal,_1UL>::~SmallVector
                  ((SmallVector<wasm::Literal,_1UL> *)auStack_1a8);
        lVar44 = lVar44 + 0x18;
      }
      goto LAB_001402e1;
    }
    Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    break;
  case RefAsId:
    visit((Flow *)auStack_378,this,(Expression *)curr[1].type.id);
    if (ref.breakTo.super_IString.str._M_len == 0) {
      pLVar30 = Flow::getSingleValue((Flow *)auStack_378);
      iVar18 = *(int *)(curr + 1);
      if (iVar18 == 2) {
        wasm::Literal::externalize();
        Flow::Flow(__return_storage_ptr__,(Literal *)auStack_98);
      }
      else if (iVar18 == 1) {
        wasm::Literal::internalize();
        Flow::Flow(__return_storage_ptr__,(Literal *)auStack_98);
      }
      else {
        if (iVar18 != 0) {
          wasm::handle_unreachable
                    ("unimplemented ref.as_*",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                     ,0x82e);
        }
        bVar61 = Type::isNull(&pLVar30->type);
        if (bVar61) {
          (*this->_vptr_ExpressionRunner[2])(this,"null ref");
        }
        wasm::Literal::Literal((Literal *)auStack_98,pLVar30);
        Flow::Flow(__return_storage_ptr__,(Literal *)auStack_98);
      }
      pLVar30 = (Literal *)auStack_98;
      goto LAB_00140a8a;
    }
    Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    break;
  case StringNewId:
    visit((Flow *)auStack_98,this,(Expression *)curr[1].type.id);
    if (start.breakTo.super_IString.str._M_len == 0) {
      if (*(int *)(curr + 1) == 2) {
        Flow::getSingleValue((Flow *)auStack_98);
        uVar50 = wasm::Literal::getUnsigned();
        if (0x10ffff < uVar50) {
          (*this->_vptr_ExpressionRunner[2])(this,"invalid code point");
        }
        std::__cxx11::stringstream::stringstream((stringstream *)auStack_378);
        wasm::String::writeWTF16CodePoint
                  ((ostream *)&ref.values.super_SmallVector<wasm::Literal,_1UL>.fixed,uVar50);
        std::__cxx11::stringbuf::str();
        wasm::Literal::Literal
                  ((Literal *)auStack_138,end.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed
                   ,auStack_e8);
        Flow::Flow(__return_storage_ptr__,(Literal *)auStack_138);
        wasm::Literal::~Literal((Literal *)auStack_138);
        std::__cxx11::string::~string((string *)auStack_e8);
        std::__cxx11::stringstream::~stringstream((stringstream *)auStack_378);
      }
      else {
        if (*(int *)(curr + 1) == 1) {
          visit((Flow *)auStack_378,this,*(Expression **)(curr + 2));
          if (ref.breakTo.super_IString.str._M_len == 0) {
            visit((Flow *)auStack_e8,this,(Expression *)curr[2].type.id);
            if (end.breakTo.super_IString.str._M_len == 0) {
              Flow::getSingleValue((Flow *)auStack_98);
              wasm::Literal::getGCData();
              start.breakTo.super_IString.str._M_str = (char *)auStack_158;
              if (auStack_158 == (undefined1  [8])0x0) {
                (*this->_vptr_ExpressionRunner[2])(this,"null ref");
              }
              start.breakTo.super_IString.str._M_str = (char *)auStack_158;
              Flow::getSingleValue((Flow *)auStack_378);
              uVar59 = wasm::Literal::getUnsigned();
              Flow::getSingleValue((Flow *)auStack_e8);
              uVar32 = wasm::Literal::getUnsigned();
              uVar45 = (*(long *)(start.breakTo.super_IString.str._M_str + 0x30) -
                       *(long *)(start.breakTo.super_IString.str._M_str + 0x28)) / 0x18 +
                       *(long *)(start.breakTo.super_IString.str._M_str + 8);
              TVar33.id = (uintptr_t)start.breakTo.super_IString.str._M_str;
              if (((uVar45 < uVar59) || (uVar32 < uVar59)) || (uVar45 < uVar32)) {
                (*this->_vptr_ExpressionRunner[2])
                          (this,"array oob",
                           (*(long *)(start.breakTo.super_IString.str._M_str + 0x30) -
                           *(long *)(start.breakTo.super_IString.str._M_str + 0x28)) % 0x18);
              }
              contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
              contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
              contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.
              super_IString.str._M_str = (char *)0x0;
              auStack_138 = (undefined1  [8])0x0;
              contents.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
              if (uVar59 <= uVar32 && uVar32 - uVar59 != 0) {
                SmallVector<wasm::Literal,_1UL>::reserve
                          ((SmallVector<wasm::Literal,_1UL> *)auStack_138,uVar32 - uVar59);
                pLVar30 = (Literal *)(start.breakTo.super_IString.str._M_str + 0x10);
                lVar56 = uVar59 * 0x18 + -0x18;
                for (; uVar59 < uVar32; uVar59 = uVar59 + 1) {
                  pLVar47 = (Literal *)
                            (*(long *)(start.breakTo.super_IString.str._M_str + 0x28) + lVar56);
                  if (uVar59 == 0) {
                    pLVar47 = pLVar30;
                  }
                  SmallVector<wasm::Literal,_1UL>::push_back
                            ((SmallVector<wasm::Literal,_1UL> *)auStack_138,pLVar47);
                  lVar56 = lVar56 + 0x18;
                }
              }
              makeGCData((Literal *)auStack_1a8,
                         (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)
                         auStack_138,(Literals *)(curr->type).id,TVar33);
              Flow::Flow(__return_storage_ptr__,(Literal *)auStack_1a8);
              wasm::Literal::~Literal((Literal *)auStack_1a8);
              SmallVector<wasm::Literal,_1UL>::~SmallVector
                        ((SmallVector<wasm::Literal,_1UL> *)auStack_138);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&refData);
            }
            else {
              Flow::Flow(__return_storage_ptr__,(Flow *)auStack_e8);
            }
            pSVar25 = (SmallVector<wasm::Literal,_1UL> *)auStack_e8;
            goto LAB_0013bfef;
          }
          Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
          goto LAB_0013bff4;
        }
        sVar28 = CONCAT44(NONCONSTANT_FLOW._4_4_,(undefined4)NONCONSTANT_FLOW);
        pcVar54 = (char *)CONCAT44(uRam0000000000181fd4,_extendLowUToI32x4);
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
        field_0.func.super_IString.str._M_str = (char *)0x0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
        type.id = 0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
        field_0.i64 = 0;
        (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (__return_storage_ptr__->breakTo).super_IString.str._M_len = sVar28;
        (__return_storage_ptr__->breakTo).super_IString.str._M_str = pcVar54;
      }
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_98);
    }
LAB_0013c000:
    pSVar25 = (SmallVector<wasm::Literal,_1UL> *)auStack_98;
    goto LAB_00140a96;
  case StringConstId:
    wasm::Literal::Literal((Literal *)auStack_378,*(undefined8 *)(curr + 1),curr[1].type.id);
    Flow::Flow(__return_storage_ptr__,(Literal *)auStack_378);
LAB_0013a312:
    pLVar30 = (Literal *)auStack_378;
LAB_0013a319:
    wasm::Literal::~Literal(pLVar30);
    goto LAB_00140a9b;
  case StringMeasureId:
    if (*(int *)(curr + 1) != 1) goto switchD_00138b19_caseD_5a;
    visit((Flow *)auStack_378,this,(Expression *)curr[1].type.id);
    if (ref.breakTo.super_IString.str._M_len == 0) {
      pLVar30 = Flow::getSingleValue((Flow *)auStack_378);
      wasm::Literal::Literal((Literal *)auStack_98,pLVar30);
      wasm::Literal::getGCData();
      if (auStack_138 == (undefined1  [8])0x0) {
        (*this->_vptr_ExpressionRunner[2])(this,"null ref");
      }
      auStack_e8._0_4_ =
           (int)(((long)(((Literals *)((long)auStack_138 + 8))->
                        super_SmallVector<wasm::Literal,_1UL>).flexible.
                        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(((Literals *)((long)auStack_138 + 8))->super_SmallVector<wasm::Literal,_1UL>
                       ).flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                       _M_impl.super__Vector_impl_data._M_start) / 0x18) +
           *(int *)&(((Literals *)((long)auStack_138 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                    usedFixed;
      end.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 2;
      Flow::Flow(__return_storage_ptr__,(Literal *)auStack_e8);
      wasm::Literal::~Literal((Literal *)auStack_e8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&contents);
      goto LAB_0013f019;
    }
    Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    break;
  case StringEncodeId:
    if (*(int *)(curr + 1) != 1) goto switchD_00138b19_caseD_5a;
    visit((Flow *)auStack_378,this,(Expression *)curr[1].type.id);
    if (ref.breakTo.super_IString.str._M_len == 0) {
      visit((Flow *)auStack_98,this,*(Expression **)(curr + 2));
      if (start.breakTo.super_IString.str._M_len == 0) {
        visit((Flow *)auStack_e8,this,(Expression *)curr[2].type.id);
        if (end.breakTo.super_IString.str._M_len != 0) {
          Flow::Flow(__return_storage_ptr__,(Flow *)auStack_e8);
          goto LAB_00140855;
        }
        Flow::getSingleValue((Flow *)auStack_378);
        wasm::Literal::getGCData();
        Flow::getSingleValue((Flow *)auStack_98);
        wasm::Literal::getGCData();
        if ((auStack_1a8 == (undefined1  [8])0x0) || (auStack_158 == (undefined1  [8])0x0)) {
          (*this->_vptr_ExpressionRunner[2])(this,"null ref");
        }
        Flow::getSingleValue((Flow *)auStack_e8);
        end.breakTo.super_IString.str._M_str = (char *)wasm::Literal::getUnsigned();
        auVar52 = auStack_1a8;
        lVar56 = (long)(((Literals *)((long)auStack_1a8 + 8))->super_SmallVector<wasm::Literal,_1UL>
                       ).flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(((Literals *)((long)auStack_1a8 + 8))->super_SmallVector<wasm::Literal,_1UL>
                       ).flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        start.breakTo.super_IString.str._M_str = (char *)auStack_158;
        uVar59 = (long)&(((Module *)
                         (((Literals *)((long)auStack_1a8 + 8))->
                         super_SmallVector<wasm::Literal,_1UL>).usedFixed)->exports).
                        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar56 / 0x18;
        if ((CARRY8(uVar59,(ulong)end.breakTo.super_IString.str._M_str)) ||
           (lVar56 = (long)(((Literals *)((long)auStack_158 + 8))->
                           super_SmallVector<wasm::Literal,_1UL>).flexible.
                           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)(((Literals *)((long)auStack_158 + 8))->
                           super_SmallVector<wasm::Literal,_1UL>).flexible.
                           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl
                           .super__Vector_impl_data._M_start,
           (char *)(lVar56 / 0x18 +
                   (((Literals *)((long)auStack_158 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                   usedFixed) < end.breakTo.super_IString.str._M_str + uVar59)) {
          (*this->_vptr_ExpressionRunner[2])(this,"oob",lVar56 % 0x18);
        }
        pLVar30 = (Literal *)(start.breakTo.super_IString.str._M_str + 0x10);
        uVar50 = 0;
        while( true ) {
          uVar59 = (ulong)uVar50;
          pLVar51 = (((Literals *)((long)auVar52 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                    flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)&(((Module *)
                              (((Literals *)((long)auVar52 + 8))->
                              super_SmallVector<wasm::Literal,_1UL>).usedFixed)->exports).
                             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start +
                     ((long)(((Literals *)((long)auVar52 + 8))->
                            super_SmallVector<wasm::Literal,_1UL>).flexible.
                            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pLVar51) / 0x18) <=
              uVar59) break;
          pLVar47 = pLVar51 + (uVar59 - 1);
          if (uVar59 == 0) {
            pLVar47 = (((Literals *)((long)auVar52 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                      fixed._M_elems;
          }
          this_02 = (Literal *)
                    (*(long *)(start.breakTo.super_IString.str._M_str + 0x28) + -0x18 +
                    (long)(end.breakTo.super_IString.str._M_str + uVar59) * 0x18);
          if (end.breakTo.super_IString.str._M_str + uVar59 == (char *)0x0) {
            this_02 = pLVar30;
          }
          wasm::Literal::operator=(this_02,pLVar47);
          uVar50 = uVar50 + 1;
        }
        auStack_138._0_4_ =
             (int)(((long)(((Literals *)((long)auStack_1a8 + 8))->
                          super_SmallVector<wasm::Literal,_1UL>).flexible.
                          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(((Literals *)((long)auStack_1a8 + 8))->
                         super_SmallVector<wasm::Literal,_1UL>).flexible.
                         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                         super__Vector_impl_data._M_start) / 0x18) +
             *(int *)&(((Literals *)((long)auStack_1a8 + 8))->super_SmallVector<wasm::Literal,_1UL>)
                      .usedFixed;
        contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 2;
        Flow::Flow(__return_storage_ptr__,(Literal *)auStack_138);
        wasm::Literal::~Literal((Literal *)auStack_138);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&refData);
        pFVar53 = &length;
        goto LAB_0013ed48;
      }
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_98);
      goto LAB_00140861;
    }
    Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    break;
  case StringConcatId:
    visit((Flow *)auStack_378,this,*(Expression **)(curr + 1));
    if (ref.breakTo.super_IString.str._M_len != 0) {
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
      break;
    }
    pLVar30 = Flow::getSingleValue((Flow *)auStack_378);
    wasm::Literal::Literal((Literal *)auStack_e8,pLVar30);
    visit((Flow *)auStack_98,this,(Expression *)curr[1].type.id);
    Flow::operator=((Flow *)auStack_378,(Flow *)auStack_98);
    SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)auStack_98);
    if (ref.breakTo.super_IString.str._M_len != 0) {
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
      goto LAB_00140a83;
    }
    pLVar30 = Flow::getSingleValue((Flow *)auStack_378);
    wasm::Literal::Literal((Literal *)auStack_138,pLVar30);
    wasm::Literal::getGCData();
    wasm::Literal::getGCData();
    if (auStack_158 == (undefined1  [8])0x0 || auStack_1c8 == (undefined1  [8])0x0) {
      (*this->_vptr_ExpressionRunner[2])(this,"null ref");
    }
    lVar56 = (long)(((Literals *)((long)auStack_1c8 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                   flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(((Literals *)((long)auStack_1c8 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                   flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    if (0x2aaaaa9 <
        (long)&(((Module *)
                (((Literals *)((long)auStack_1c8 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                usedFixed)->exports).
               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start +
        lVar56 / 0x18 +
        ((long)(((Literals *)((long)auStack_158 + 8))->super_SmallVector<wasm::Literal,_1UL>).
               flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
               super__Vector_impl_data._M_finish -
        (long)(((Literals *)((long)auStack_158 + 8))->super_SmallVector<wasm::Literal,_1UL>).
              flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_start) / 0x18 +
        (((Literals *)((long)auStack_158 + 8))->super_SmallVector<wasm::Literal,_1UL>).usedFixed) {
      (*this->_vptr_ExpressionRunner[3])(this,"allocation failure",lVar56 % 0x18);
    }
    start.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    start.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    start.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
    start.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.
    str._M_str = (char *)0x0;
    auStack_98 = (undefined1  [8])0x0;
    start.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    start.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    TVar33.id = ((long)(((Literals *)((long)auStack_158 + 8))->super_SmallVector<wasm::Literal,_1UL>
                       ).flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(((Literals *)((long)auStack_158 + 8))->super_SmallVector<wasm::Literal,_1UL>)
                      .flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                      _M_impl.super__Vector_impl_data._M_start) / 0x18;
    SmallVector<wasm::Literal,_1UL>::reserve
              ((SmallVector<wasm::Literal,_1UL> *)auStack_98,
               (long)&(((Module *)
                       (((Literals *)((long)auStack_1c8 + 8))->super_SmallVector<wasm::Literal,_1UL>
                       ).usedFixed)->exports).
                      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
               ((long)(((Literals *)((long)auStack_1c8 + 8))->super_SmallVector<wasm::Literal,_1UL>)
                      .flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(((Literals *)((long)auStack_1c8 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                     flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x18 +
               TVar33.id +
               (((Literals *)((long)auStack_158 + 8))->super_SmallVector<wasm::Literal,_1UL>).
               usedFixed);
    auVar52 = auStack_158;
    pLVar23 = (Literals *)((long)auStack_158 + 8);
    IVar67 = SmallVector<wasm::Literal,_1UL>::end((SmallVector<wasm::Literal,_1UL> *)pLVar23);
    start.breakTo.super_IString.str._M_str =
         (char *)IVar67.
                 super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                 .index;
    lVar56 = -0x18;
    for (pcVar54 = (char *)0x0; auVar13 = auStack_1c8,
        start.breakTo.super_IString.str._M_str != pcVar54 ||
        (SmallVector<wasm::Literal,_1UL> *)pLVar23 !=
        IVar67.
        super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
        .parent; pcVar54 = pcVar54 + 1) {
      pLVar30 = (Literal *)
                ((long)&((((Literals *)((long)auVar52 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                         flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                         _M_impl.super__Vector_impl_data._M_start)->field_0 + lVar56);
      if (pcVar54 == (char *)0x0) {
        pLVar30 = (((Literals *)((long)auVar52 + 8))->super_SmallVector<wasm::Literal,_1UL>).fixed.
                  _M_elems;
      }
      SmallVector<wasm::Literal,_1UL>::push_back
                ((SmallVector<wasm::Literal,_1UL> *)auStack_98,pLVar30);
      lVar56 = lVar56 + 0x18;
    }
    pLVar23 = (Literals *)((long)auStack_1c8 + 8);
    IVar67 = SmallVector<wasm::Literal,_1UL>::end((SmallVector<wasm::Literal,_1UL> *)pLVar23);
    start.breakTo.super_IString.str._M_str =
         (char *)IVar67.
                 super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                 .index;
    lVar56 = -0x18;
    for (pcVar54 = (char *)0x0;
        start.breakTo.super_IString.str._M_str != pcVar54 ||
        (SmallVector<wasm::Literal,_1UL> *)pLVar23 !=
        IVar67.
        super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
        .parent; pcVar54 = pcVar54 + 1) {
      pLVar30 = (Literal *)
                ((long)&((((Literals *)((long)auVar13 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                         flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                         _M_impl.super__Vector_impl_data._M_start)->field_0 + lVar56);
      if (pcVar54 == (char *)0x0) {
        pLVar30 = (((Literals *)((long)auVar13 + 8))->super_SmallVector<wasm::Literal,_1UL>).fixed.
                  _M_elems;
      }
      SmallVector<wasm::Literal,_1UL>::push_back
                ((SmallVector<wasm::Literal,_1UL> *)auStack_98,pLVar30);
      lVar56 = lVar56 + 0x18;
    }
    makeGCData((Literal *)auStack_1a8,
               (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)auStack_98,
               (Literals *)(curr->type).id,TVar33);
    Flow::Flow(__return_storage_ptr__,(Literal *)auStack_1a8);
    wasm::Literal::~Literal((Literal *)auStack_1a8);
    SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)auStack_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&destData);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&refData);
LAB_00140a77:
    pLVar30 = (Literal *)auStack_138;
LAB_00140a7e:
    wasm::Literal::~Literal(pLVar30);
LAB_00140a83:
    pLVar30 = (Literal *)auStack_e8;
    goto LAB_00140a8a;
  case StringEqId:
    visit((Flow *)auStack_378,this,(Expression *)curr[1].type.id);
    if (ref.breakTo.super_IString.str._M_len == 0) {
      pLVar30 = Flow::getSingleValue((Flow *)auStack_378);
      wasm::Literal::Literal((Literal *)auStack_e8,pLVar30);
      visit((Flow *)auStack_98,this,*(Expression **)(curr + 2));
      Flow::operator=((Flow *)auStack_378,(Flow *)auStack_98);
      SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)auStack_98);
      if (ref.breakTo.super_IString.str._M_len == 0) {
        pLVar30 = Flow::getSingleValue((Flow *)auStack_378);
        wasm::Literal::Literal((Literal *)auStack_98,pLVar30);
        wasm::Literal::getGCData();
        wasm::Literal::getGCData();
        if (*(int *)(curr + 1) == 0) {
          bVar61 = auStack_1a8 == (undefined1  [8])0x0 && auStack_158 == (undefined1  [8])0x0;
          if (auStack_158 != (undefined1  [8])0x0 && auStack_1a8 != (undefined1  [8])0x0) {
            bVar61 = SmallVector<wasm::Literal,_1UL>::operator==
                               ((SmallVector<wasm::Literal,_1UL> *)((long)auStack_1a8 + 8),
                                (SmallVector<wasm::Literal,_1UL> *)((long)auStack_158 + 8));
          }
          auStack_138._0_4_ = ZEXT14(bVar61);
        }
        else {
          if (*(int *)(curr + 1) != 1) {
            wasm::handle_unreachable
                      ("bad op",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                       ,0x8fd);
          }
          if (auStack_1a8 == (undefined1  [8])0x0 || auStack_158 == (undefined1  [8])0x0) {
            (*this->_vptr_ExpressionRunner[2])(this,"null ref");
          }
          auVar13 = auStack_158;
          auVar52 = auStack_1a8;
          start.breakTo.super_IString.str._M_str =
               (char *)&(((Literals *)((long)auStack_1a8 + 8))->
                        super_SmallVector<wasm::Literal,_1UL>).fixed;
          end.breakTo.super_IString.str._M_str =
               (char *)&(((Literals *)((long)auStack_158 + 8))->
                        super_SmallVector<wasm::Literal,_1UL>).fixed;
          uVar50 = 0;
          do {
            uVar32 = (ulong)uVar50;
            uVar59 = ((long)(((Literals *)((long)auVar13 + 8))->
                            super_SmallVector<wasm::Literal,_1UL>).flexible.
                            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(((Literals *)((long)auVar13 + 8))->super_SmallVector<wasm::Literal,_1UL>
                           ).flexible.
                           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl
                           .super__Vector_impl_data._M_start) / 0x18 +
                     (((Literals *)((long)auVar13 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                     usedFixed;
            if ((long)&(((Module *)
                        (((Literals *)((long)auVar52 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                        usedFixed)->exports).
                       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start +
                ((long)(((Literals *)((long)auVar52 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                       flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(((Literals *)((long)auVar52 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                      flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                      _M_impl.super__Vector_impl_data._M_start) / 0x18 == uVar32) {
              auStack_138._0_4_ = -(uint)(uVar59 != uVar32);
              goto LAB_0013ffe4;
            }
            if (uVar59 == uVar32) break;
            lVar56 = wasm::Literal::getInteger();
            lVar31 = wasm::Literal::getInteger();
            if (lVar56 < lVar31) {
              auStack_138._0_4_ = 0xffffffff;
              goto LAB_0013ffe4;
            }
            uVar50 = uVar50 + 1;
          } while (lVar56 <= lVar31);
          auStack_138._0_4_ = 1;
        }
LAB_0013ffe4:
        contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 2;
        Flow::Flow(__return_storage_ptr__,(Literal *)auStack_138);
        wasm::Literal::~Literal((Literal *)auStack_138);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&refData);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&length);
        goto LAB_00140233;
      }
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
      goto LAB_00140a83;
    }
    Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    break;
  case StringWTF16GetId:
    visit((Flow *)auStack_378,this,*(Expression **)(curr + 1));
    if (ref.breakTo.super_IString.str._M_len != 0) {
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
      break;
    }
    visit((Flow *)auStack_98,this,(Expression *)curr[1].type.id);
    if (start.breakTo.super_IString.str._M_len != 0) {
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_98);
      goto LAB_00140861;
    }
    pLVar30 = Flow::getSingleValue((Flow *)auStack_378);
    wasm::Literal::Literal((Literal *)auStack_e8,pLVar30);
    wasm::Literal::getGCData();
    if (auStack_1a8 == (undefined1  [8])0x0) {
      (*this->_vptr_ExpressionRunner[2])(this,"null ref");
    }
    auVar52 = auStack_1a8;
    pLVar30 = Flow::getSingleValue((Flow *)auStack_98);
    uVar50 = Literal::geti32(pLVar30);
    pLVar51 = (((Literals *)((long)auVar52 + 8))->super_SmallVector<wasm::Literal,_1UL>).flexible.
              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar56 = (long)(((Literals *)((long)auVar52 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                   flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)pLVar51;
    if ((ulong)((long)&(((Module *)
                        (((Literals *)((long)auVar52 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                        usedFixed)->exports).
                       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar56 / 0x18) <= (ulong)uVar50)
    {
      (*this->_vptr_ExpressionRunner[2])(this,"string oob",lVar56 % 0x18);
      pLVar51 = (((Literals *)((long)auVar52 + 8))->super_SmallVector<wasm::Literal,_1UL>).flexible.
                super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                super__Vector_impl_data._M_start;
    }
    pLVar30 = pLVar51 + ((ulong)uVar50 - 1);
    if (uVar50 == 0) {
      pLVar30 = (((Literals *)((long)auVar52 + 8))->super_SmallVector<wasm::Literal,_1UL>).fixed.
                _M_elems;
    }
    auStack_138._0_4_ = Literal::geti32(pLVar30);
    contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 2;
    Flow::Flow(__return_storage_ptr__,(Literal *)auStack_138);
    wasm::Literal::~Literal((Literal *)auStack_138);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&length);
LAB_0013f84f:
    pLVar30 = (Literal *)auStack_e8;
LAB_0013f856:
    wasm::Literal::~Literal(pLVar30);
LAB_00140861:
    SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)auStack_98);
    break;
  case StringSliceWTFId:
    visit((Flow *)auStack_378,this,*(Expression **)(curr + 1));
    if (ref.breakTo.super_IString.str._M_len == 0) {
      visit((Flow *)auStack_98,this,(Expression *)curr[1].type.id);
      if (start.breakTo.super_IString.str._M_len == 0) {
        visit((Flow *)auStack_e8,this,*(Expression **)(curr + 2));
        if (end.breakTo.super_IString.str._M_len == 0) {
          Flow::getSingleValue((Flow *)auStack_378);
          wasm::Literal::getGCData();
          if (auStack_158 == (undefined1  [8])0x0) {
            (*this->_vptr_ExpressionRunner[2])(this,"null ref");
          }
          auVar52 = auStack_158;
          Flow::getSingleValue((Flow *)auStack_98);
          uVar32 = wasm::Literal::getUnsigned();
          Flow::getSingleValue((Flow *)auStack_e8);
          TVar33.id = wasm::Literal::getUnsigned();
          uVar59 = ((long)(((Literals *)((long)auVar52 + 8))->super_SmallVector<wasm::Literal,_1UL>)
                          .flexible.
                          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(((Literals *)((long)auVar52 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                         flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                         _M_impl.super__Vector_impl_data._M_start) / 0x18 +
                   (((Literals *)((long)auVar52 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                   usedFixed;
          if (TVar33.id <= uVar59) {
            uVar59 = TVar33.id;
          }
          contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
          contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
          contents.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.
          super_IString.str._M_str = (char *)0x0;
          auStack_138 = (undefined1  [8])0x0;
          contents.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
          if (uVar32 <= uVar59 && uVar59 - uVar32 != 0) {
            SmallVector<wasm::Literal,_1UL>::reserve
                      ((SmallVector<wasm::Literal,_1UL> *)auStack_138,uVar59 - uVar32);
            start.breakTo.super_IString.str._M_str =
                 (char *)&(((Literals *)((long)auVar52 + 8))->super_SmallVector<wasm::Literal,_1UL>)
                          .fixed;
            lVar56 = uVar32 * 0x18 + -0x18;
            for (; uVar32 < uVar59; uVar32 = uVar32 + 1) {
              pLVar51 = (((Literals *)((long)auVar52 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                        flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              if (uVar32 < ((long)(((Literals *)((long)auVar52 + 8))->
                                  super_SmallVector<wasm::Literal,_1UL>).flexible.
                                  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)pLVar51) / 0x18
                           + (((Literals *)((long)auVar52 + 8))->
                             super_SmallVector<wasm::Literal,_1UL>).usedFixed) {
                pLVar30 = (Literal *)((long)&pLVar51->field_0 + lVar56);
                if (uVar32 == 0) {
                  pLVar30 = (Literal *)start.breakTo.super_IString.str._M_str;
                }
                SmallVector<wasm::Literal,_1UL>::push_back
                          ((SmallVector<wasm::Literal,_1UL> *)auStack_138,pLVar30);
              }
              lVar56 = lVar56 + 0x18;
            }
          }
          makeGCData((Literal *)auStack_1a8,
                     (ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *)auStack_138,
                     (Literals *)(curr->type).id,TVar33);
          Flow::Flow(__return_storage_ptr__,(Literal *)auStack_1a8);
          wasm::Literal::~Literal((Literal *)auStack_1a8);
          SmallVector<wasm::Literal,_1UL>::~SmallVector
                    ((SmallVector<wasm::Literal,_1UL> *)auStack_138);
          goto LAB_0013ed41;
        }
        Flow::Flow(__return_storage_ptr__,(Flow *)auStack_e8);
        goto LAB_00140855;
      }
      Flow::Flow(__return_storage_ptr__,(Flow *)auStack_98);
      goto LAB_00140861;
    }
    Flow::Flow(__return_storage_ptr__,(Flow *)auStack_378);
    break;
  case ContNewId:
  case ContBindId:
  case SuspendId:
  case ResumeId:
  case ResumeThrowId:
  case StackSwitchId:
switchD_00138b19_caseD_5a:
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0
    .func.super_IString.str._M_str = (char *)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id
         = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0
    .i64 = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_00138b3c:
    *(undefined4 *)&(__return_storage_ptr__->breakTo).super_IString.str._M_len = uVar62;
    *(undefined4 *)((long)&(__return_storage_ptr__->breakTo).super_IString.str._M_len + 4) = uVar63;
    *(undefined4 *)&(__return_storage_ptr__->breakTo).super_IString.str._M_str = uVar64;
    *(undefined4 *)((long)&(__return_storage_ptr__->breakTo).super_IString.str._M_str + 4) = uVar65;
    goto LAB_00140a9b;
  default:
    wasm::handle_unreachable
              ("unexpected expression type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
               ,0x46);
  }
LAB_00140a8f:
  pSVar25 = (SmallVector<wasm::Literal,_1UL> *)auStack_378;
LAB_00140a96:
  SmallVector<wasm::Literal,_1UL>::~SmallVector(pSVar25);
LAB_00140a9b:
  if ((__return_storage_ptr__->breakTo).super_IString.str._M_str == (char *)0x0) {
    TVar48 = Literals::getType(&__return_storage_ptr__->values);
    TVar33.id = (curr->type).id;
    if (1 < TVar33.id || 1 < TVar48.id) {
      cVar16 = wasm::Type::isSubType(TVar48,TVar33);
      if (cVar16 == '\0') {
        poVar49 = std::operator<<((ostream *)&std::cerr,"expected ");
        poVar49 = (ostream *)std::operator<<(poVar49,this->module,(curr->type).id);
        poVar49 = std::operator<<(poVar49,", seeing ");
        poVar49 = (ostream *)std::operator<<(poVar49,this->module,TVar48.id);
        poVar49 = std::operator<<(poVar49," from\n");
        poVar49 = (ostream *)std::operator<<(poVar49,this->module,curr);
        std::operator<<(poVar49,'\n');
      }
      cVar16 = wasm::Type::isSubType(TVar48,(Type)(curr->type).id);
      if (cVar16 == '\0') {
        __assert_fail("Type::isSubType(type, curr->type)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                      ,0x10b,
                      "Flow wasm::ExpressionRunner<(anonymous namespace)::EvallingModuleRunner>::visit(Expression *) [SubType = (anonymous namespace)::EvallingModuleRunner]"
                     );
      }
    }
  }
  this->depth = this->depth - 1;
  return __return_storage_ptr__;
LAB_0013a591:
  for (index = (pointer)0x0;
      index < (pMVar6->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
      index = (pointer)((long)&(index->_M_t).
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 1)) {
    if ((index != (pointer)0x0) ||
       (auStack_e8 == (undefined1  [8])start.breakTo.super_IString.str._M_str)) {
      ppEVar20 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            &(pMVar6->functions).
                             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,(size_t)index);
      visit((Flow *)auStack_378,this,*ppEVar20);
      Flow::operator=(__return_storage_ptr__,(Flow *)auStack_378);
      SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)auStack_378);
      puVar24 = (pointer)(__return_storage_ptr__->breakTo).super_IString.str._M_str;
      if (puVar24 != (pointer)0x0) {
        if (puVar24 !=
            (pointer)(((Literals *)((long)auStack_e8 + 8))->super_SmallVector<wasm::Literal,_1UL>).
                     fixed._M_elems[0].field_0.func.super_IString.str._M_str) goto LAB_0013a54b;
        goto LAB_0013a579;
      }
    }
  }
LAB_0013a586:
  puVar24 = (pointer)0x0;
  goto LAB_0013a54b;
}

Assistant:

Flow visit(Expression* curr) {
    depth++;
    if (maxDepth != NO_LIMIT && depth > maxDepth) {
      hostLimit("interpreter recursion limit");
    }
    auto ret = OverriddenVisitor<SubType, Flow>::visit(curr);
    if (!ret.breaking()) {
      Type type = ret.getType();
      if (type.isConcrete() || curr->type.isConcrete()) {
#if 1 // def WASM_INTERPRETER_DEBUG
        if (!Type::isSubType(type, curr->type)) {
          std::cerr << "expected " << ModuleType(*module, curr->type)
                    << ", seeing " << ModuleType(*module, type) << " from\n"
                    << ModuleExpression(*module, curr) << '\n';
        }
#endif
        assert(Type::isSubType(type, curr->type));
      }
    }
    depth--;
    return ret;
  }